

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  long lVar77;
  undefined1 auVar78 [12];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 (*pauVar81) [32];
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  int iVar87;
  uint uVar88;
  long lVar89;
  ulong uVar90;
  float fVar91;
  float fVar120;
  float fVar122;
  __m128 a;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar124;
  undefined1 auVar106 [32];
  float fVar121;
  float fVar123;
  float fVar125;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar94 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar100 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar129;
  float fVar156;
  float fVar157;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar158;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar160 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar204;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [28];
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar207;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar208;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar233;
  float fVar252;
  float fVar254;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar234;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar242 [32];
  float fVar256;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar253;
  float fVar255;
  float fVar257;
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar267 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar282;
  float fVar285;
  float fVar291;
  float fVar294;
  float fVar297;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar288;
  undefined1 auVar273 [32];
  float fVar283;
  float fVar286;
  float fVar289;
  float fVar292;
  float fVar295;
  float fVar298;
  undefined1 auVar274 [32];
  float fVar284;
  float fVar287;
  float fVar290;
  float fVar293;
  float fVar296;
  float fVar299;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  float fVar300;
  float fVar311;
  float fVar312;
  float fVar314;
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar332;
  float fVar333;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar334;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar335;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar346;
  float fVar348;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar350 [16];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar357;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar369;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar370;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float in_register_0000151c;
  undefined1 auVar371 [32];
  float fVar378;
  float fVar379;
  undefined1 auVar380 [16];
  float fVar386;
  float fVar387;
  float fVar389;
  float fVar390;
  float fVar391;
  undefined1 auVar381 [32];
  float fVar392;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar388;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float in_register_0000159c;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [16];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float in_register_000015dc;
  undefined1 auVar402 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined1 local_ca0 [32];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 (*local_a40) [16];
  undefined1 (*local_a38) [16];
  uint *local_a30;
  Primitive *local_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar7 = prim[1];
  uVar90 = (ulong)(byte)PVar7;
  lVar89 = uVar90 * 5;
  lVar77 = uVar90 * 0x19;
  auVar132 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar177 = *(float *)(prim + lVar77 + 0x12);
  auVar132 = vsubps_avx(auVar132,*(undefined1 (*) [16])(prim + lVar77 + 6));
  auVar130._0_4_ = fVar177 * auVar132._0_4_;
  auVar130._4_4_ = fVar177 * auVar132._4_4_;
  auVar130._8_4_ = fVar177 * auVar132._8_4_;
  auVar130._12_4_ = fVar177 * auVar132._12_4_;
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 4 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 4 + 10)));
  auVar235._0_4_ = fVar177 * auVar17._0_4_;
  auVar235._4_4_ = fVar177 * auVar17._4_4_;
  auVar235._8_4_ = fVar177 * auVar17._8_4_;
  auVar235._12_4_ = fVar177 * auVar17._12_4_;
  auVar101._16_16_ = auVar24;
  auVar101._0_16_ = auVar132;
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar89 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar89 + 10)));
  auVar164._16_16_ = auVar17;
  auVar164._0_16_ = auVar132;
  auVar155 = vcvtdq2ps_avx(auVar164);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 6 + 10)));
  auVar194._16_16_ = auVar17;
  auVar194._0_16_ = auVar132;
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xb + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xb + 10)));
  auVar13 = vcvtdq2ps_avx(auVar194);
  auVar195._16_16_ = auVar17;
  auVar195._0_16_ = auVar132;
  auVar14 = vcvtdq2ps_avx(auVar195);
  uVar86 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 10)));
  auVar270._16_16_ = auVar17;
  auVar270._0_16_ = auVar132;
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar90 + 6)));
  auVar340 = vcvtdq2ps_avx(auVar270);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar90 + 10)));
  auVar301._16_16_ = auVar17;
  auVar301._0_16_ = auVar132;
  lVar12 = uVar90 * 9;
  uVar86 = (ulong)(uint)((int)lVar12 * 2);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar167 = vcvtdq2ps_avx(auVar301);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 10)));
  auVar302._16_16_ = auVar17;
  auVar302._0_16_ = auVar132;
  auVar328 = vcvtdq2ps_avx(auVar302);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar90 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar90 + 10)));
  auVar336._16_16_ = auVar17;
  auVar336._0_16_ = auVar132;
  uVar86 = (ulong)(uint)((int)lVar89 << 2);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 10)));
  auVar15 = vcvtdq2ps_avx(auVar336);
  auVar351._16_16_ = auVar17;
  auVar351._0_16_ = auVar132;
  auVar16 = vcvtdq2ps_avx(auVar351);
  auVar132 = vshufps_avx(auVar235,auVar235,0);
  auVar17 = vshufps_avx(auVar235,auVar235,0x55);
  auVar24 = vshufps_avx(auVar235,auVar235,0xaa);
  fVar177 = auVar24._0_4_;
  fVar202 = auVar24._4_4_;
  fVar203 = auVar24._8_4_;
  fVar204 = auVar24._12_4_;
  fVar205 = auVar17._0_4_;
  fVar206 = auVar17._4_4_;
  fVar207 = auVar17._8_4_;
  fVar208 = auVar17._12_4_;
  fVar224 = auVar132._0_4_;
  fVar225 = auVar132._4_4_;
  fVar226 = auVar132._8_4_;
  fVar227 = auVar132._12_4_;
  auVar371._0_4_ = fVar224 * auVar101._0_4_ + fVar205 * auVar155._0_4_ + fVar177 * auVar13._0_4_;
  auVar371._4_4_ = fVar225 * auVar101._4_4_ + fVar206 * auVar155._4_4_ + fVar202 * auVar13._4_4_;
  auVar371._8_4_ = fVar226 * auVar101._8_4_ + fVar207 * auVar155._8_4_ + fVar203 * auVar13._8_4_;
  auVar371._12_4_ = fVar227 * auVar101._12_4_ + fVar208 * auVar155._12_4_ + fVar204 * auVar13._12_4_
  ;
  auVar371._16_4_ = fVar224 * auVar101._16_4_ + fVar205 * auVar155._16_4_ + fVar177 * auVar13._16_4_
  ;
  auVar371._20_4_ = fVar225 * auVar101._20_4_ + fVar206 * auVar155._20_4_ + fVar202 * auVar13._20_4_
  ;
  auVar371._24_4_ = fVar226 * auVar101._24_4_ + fVar207 * auVar155._24_4_ + fVar203 * auVar13._24_4_
  ;
  auVar371._28_4_ = fVar208 + in_register_000015dc + in_register_0000151c;
  auVar358._0_4_ = fVar224 * auVar14._0_4_ + fVar205 * auVar340._0_4_ + auVar167._0_4_ * fVar177;
  auVar358._4_4_ = fVar225 * auVar14._4_4_ + fVar206 * auVar340._4_4_ + auVar167._4_4_ * fVar202;
  auVar358._8_4_ = fVar226 * auVar14._8_4_ + fVar207 * auVar340._8_4_ + auVar167._8_4_ * fVar203;
  auVar358._12_4_ = fVar227 * auVar14._12_4_ + fVar208 * auVar340._12_4_ + auVar167._12_4_ * fVar204
  ;
  auVar358._16_4_ = fVar224 * auVar14._16_4_ + fVar205 * auVar340._16_4_ + auVar167._16_4_ * fVar177
  ;
  auVar358._20_4_ = fVar225 * auVar14._20_4_ + fVar206 * auVar340._20_4_ + auVar167._20_4_ * fVar202
  ;
  auVar358._24_4_ = fVar226 * auVar14._24_4_ + fVar207 * auVar340._24_4_ + auVar167._24_4_ * fVar203
  ;
  auVar358._28_4_ = fVar208 + in_register_000015dc + in_register_0000159c;
  auVar242._0_4_ = fVar224 * auVar328._0_4_ + fVar205 * auVar15._0_4_ + auVar16._0_4_ * fVar177;
  auVar242._4_4_ = fVar225 * auVar328._4_4_ + fVar206 * auVar15._4_4_ + auVar16._4_4_ * fVar202;
  auVar242._8_4_ = fVar226 * auVar328._8_4_ + fVar207 * auVar15._8_4_ + auVar16._8_4_ * fVar203;
  auVar242._12_4_ = fVar227 * auVar328._12_4_ + fVar208 * auVar15._12_4_ + auVar16._12_4_ * fVar204;
  auVar242._16_4_ = fVar224 * auVar328._16_4_ + fVar205 * auVar15._16_4_ + auVar16._16_4_ * fVar177;
  auVar242._20_4_ = fVar225 * auVar328._20_4_ + fVar206 * auVar15._20_4_ + auVar16._20_4_ * fVar202;
  auVar242._24_4_ = fVar226 * auVar328._24_4_ + fVar207 * auVar15._24_4_ + auVar16._24_4_ * fVar203;
  auVar242._28_4_ = fVar227 + fVar208 + fVar204;
  auVar132 = vshufps_avx(auVar130,auVar130,0);
  auVar17 = vshufps_avx(auVar130,auVar130,0x55);
  auVar24 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar202 = auVar24._0_4_;
  fVar203 = auVar24._4_4_;
  fVar204 = auVar24._8_4_;
  fVar205 = auVar24._12_4_;
  fVar225 = auVar17._0_4_;
  fVar226 = auVar17._4_4_;
  fVar227 = auVar17._8_4_;
  fVar229 = auVar17._12_4_;
  fVar206 = auVar132._0_4_;
  fVar207 = auVar132._4_4_;
  fVar208 = auVar132._8_4_;
  fVar224 = auVar132._12_4_;
  fVar177 = auVar101._28_4_;
  auVar271._0_4_ = fVar206 * auVar101._0_4_ + fVar225 * auVar155._0_4_ + fVar202 * auVar13._0_4_;
  auVar271._4_4_ = fVar207 * auVar101._4_4_ + fVar226 * auVar155._4_4_ + fVar203 * auVar13._4_4_;
  auVar271._8_4_ = fVar208 * auVar101._8_4_ + fVar227 * auVar155._8_4_ + fVar204 * auVar13._8_4_;
  auVar271._12_4_ = fVar224 * auVar101._12_4_ + fVar229 * auVar155._12_4_ + fVar205 * auVar13._12_4_
  ;
  auVar271._16_4_ = fVar206 * auVar101._16_4_ + fVar225 * auVar155._16_4_ + fVar202 * auVar13._16_4_
  ;
  auVar271._20_4_ = fVar207 * auVar101._20_4_ + fVar226 * auVar155._20_4_ + fVar203 * auVar13._20_4_
  ;
  auVar271._24_4_ = fVar208 * auVar101._24_4_ + fVar227 * auVar155._24_4_ + fVar204 * auVar13._24_4_
  ;
  auVar271._28_4_ = fVar177 + auVar155._28_4_ + auVar13._28_4_;
  auVar143._0_4_ = fVar206 * auVar14._0_4_ + auVar167._0_4_ * fVar202 + fVar225 * auVar340._0_4_;
  auVar143._4_4_ = fVar207 * auVar14._4_4_ + auVar167._4_4_ * fVar203 + fVar226 * auVar340._4_4_;
  auVar143._8_4_ = fVar208 * auVar14._8_4_ + auVar167._8_4_ * fVar204 + fVar227 * auVar340._8_4_;
  auVar143._12_4_ = fVar224 * auVar14._12_4_ + auVar167._12_4_ * fVar205 + fVar229 * auVar340._12_4_
  ;
  auVar143._16_4_ = fVar206 * auVar14._16_4_ + auVar167._16_4_ * fVar202 + fVar225 * auVar340._16_4_
  ;
  auVar143._20_4_ = fVar207 * auVar14._20_4_ + auVar167._20_4_ * fVar203 + fVar226 * auVar340._20_4_
  ;
  auVar143._24_4_ = fVar208 * auVar14._24_4_ + auVar167._24_4_ * fVar204 + fVar227 * auVar340._24_4_
  ;
  auVar143._28_4_ = fVar177 + auVar167._28_4_ + auVar13._28_4_;
  auVar303._8_4_ = 0x7fffffff;
  auVar303._0_8_ = 0x7fffffff7fffffff;
  auVar303._12_4_ = 0x7fffffff;
  auVar303._16_4_ = 0x7fffffff;
  auVar303._20_4_ = 0x7fffffff;
  auVar303._24_4_ = 0x7fffffff;
  auVar303._28_4_ = 0x7fffffff;
  auVar337._8_4_ = 0x219392ef;
  auVar337._0_8_ = 0x219392ef219392ef;
  auVar337._12_4_ = 0x219392ef;
  auVar337._16_4_ = 0x219392ef;
  auVar337._20_4_ = 0x219392ef;
  auVar337._24_4_ = 0x219392ef;
  auVar337._28_4_ = 0x219392ef;
  auVar101 = vandps_avx(auVar371,auVar303);
  auVar101 = vcmpps_avx(auVar101,auVar337,1);
  auVar155 = vblendvps_avx(auVar371,auVar337,auVar101);
  auVar101 = vandps_avx(auVar358,auVar303);
  auVar101 = vcmpps_avx(auVar101,auVar337,1);
  auVar13 = vblendvps_avx(auVar358,auVar337,auVar101);
  auVar101 = vandps_avx(auVar242,auVar303);
  auVar101 = vcmpps_avx(auVar101,auVar337,1);
  auVar101 = vblendvps_avx(auVar242,auVar337,auVar101);
  auVar165._0_4_ = fVar225 * auVar15._0_4_ + auVar16._0_4_ * fVar202 + fVar206 * auVar328._0_4_;
  auVar165._4_4_ = fVar226 * auVar15._4_4_ + auVar16._4_4_ * fVar203 + fVar207 * auVar328._4_4_;
  auVar165._8_4_ = fVar227 * auVar15._8_4_ + auVar16._8_4_ * fVar204 + fVar208 * auVar328._8_4_;
  auVar165._12_4_ = fVar229 * auVar15._12_4_ + auVar16._12_4_ * fVar205 + fVar224 * auVar328._12_4_;
  auVar165._16_4_ = fVar225 * auVar15._16_4_ + auVar16._16_4_ * fVar202 + fVar206 * auVar328._16_4_;
  auVar165._20_4_ = fVar226 * auVar15._20_4_ + auVar16._20_4_ * fVar203 + fVar207 * auVar328._20_4_;
  auVar165._24_4_ = fVar227 * auVar15._24_4_ + auVar16._24_4_ * fVar204 + fVar208 * auVar328._24_4_;
  auVar165._28_4_ = auVar340._28_4_ + fVar205 + fVar177;
  auVar14 = vrcpps_avx(auVar155);
  fVar177 = auVar14._0_4_;
  fVar202 = auVar14._4_4_;
  auVar340._4_4_ = auVar155._4_4_ * fVar202;
  auVar340._0_4_ = auVar155._0_4_ * fVar177;
  fVar203 = auVar14._8_4_;
  auVar340._8_4_ = auVar155._8_4_ * fVar203;
  fVar204 = auVar14._12_4_;
  auVar340._12_4_ = auVar155._12_4_ * fVar204;
  fVar205 = auVar14._16_4_;
  auVar340._16_4_ = auVar155._16_4_ * fVar205;
  fVar206 = auVar14._20_4_;
  auVar340._20_4_ = auVar155._20_4_ * fVar206;
  fVar207 = auVar14._24_4_;
  auVar340._24_4_ = auVar155._24_4_ * fVar207;
  auVar340._28_4_ = auVar155._28_4_;
  auVar325._8_4_ = 0x3f800000;
  auVar325._0_8_ = 0x3f8000003f800000;
  auVar325._12_4_ = 0x3f800000;
  auVar325._16_4_ = 0x3f800000;
  auVar325._20_4_ = 0x3f800000;
  auVar325._24_4_ = 0x3f800000;
  auVar325._28_4_ = 0x3f800000;
  auVar340 = vsubps_avx(auVar325,auVar340);
  auVar155 = vrcpps_avx(auVar13);
  fVar177 = fVar177 + fVar177 * auVar340._0_4_;
  fVar202 = fVar202 + fVar202 * auVar340._4_4_;
  fVar203 = fVar203 + fVar203 * auVar340._8_4_;
  fVar204 = fVar204 + fVar204 * auVar340._12_4_;
  fVar205 = fVar205 + fVar205 * auVar340._16_4_;
  fVar206 = fVar206 + fVar206 * auVar340._20_4_;
  fVar207 = fVar207 + fVar207 * auVar340._24_4_;
  fVar233 = auVar155._0_4_;
  fVar252 = auVar155._4_4_;
  auVar167._4_4_ = fVar252 * auVar13._4_4_;
  auVar167._0_4_ = fVar233 * auVar13._0_4_;
  fVar254 = auVar155._8_4_;
  auVar167._8_4_ = fVar254 * auVar13._8_4_;
  fVar256 = auVar155._12_4_;
  auVar167._12_4_ = fVar256 * auVar13._12_4_;
  fVar258 = auVar155._16_4_;
  auVar167._16_4_ = fVar258 * auVar13._16_4_;
  fVar260 = auVar155._20_4_;
  auVar167._20_4_ = fVar260 * auVar13._20_4_;
  fVar262 = auVar155._24_4_;
  auVar167._24_4_ = fVar262 * auVar13._24_4_;
  auVar167._28_4_ = auVar14._28_4_;
  auVar155 = vsubps_avx(auVar325,auVar167);
  fVar233 = fVar233 + fVar233 * auVar155._0_4_;
  fVar252 = fVar252 + fVar252 * auVar155._4_4_;
  fVar254 = fVar254 + fVar254 * auVar155._8_4_;
  fVar256 = fVar256 + fVar256 * auVar155._12_4_;
  fVar258 = fVar258 + fVar258 * auVar155._16_4_;
  fVar260 = fVar260 + fVar260 * auVar155._20_4_;
  fVar262 = fVar262 + fVar262 * auVar155._24_4_;
  auVar155 = vrcpps_avx(auVar101);
  fVar208 = auVar155._0_4_;
  fVar224 = auVar155._4_4_;
  auVar328._4_4_ = fVar224 * auVar101._4_4_;
  auVar328._0_4_ = fVar208 * auVar101._0_4_;
  fVar225 = auVar155._8_4_;
  auVar328._8_4_ = fVar225 * auVar101._8_4_;
  fVar226 = auVar155._12_4_;
  auVar328._12_4_ = fVar226 * auVar101._12_4_;
  fVar227 = auVar155._16_4_;
  auVar328._16_4_ = fVar227 * auVar101._16_4_;
  fVar229 = auVar155._20_4_;
  auVar328._20_4_ = fVar229 * auVar101._20_4_;
  fVar231 = auVar155._24_4_;
  auVar328._24_4_ = fVar231 * auVar101._24_4_;
  auVar328._28_4_ = auVar13._28_4_;
  auVar101 = vsubps_avx(auVar325,auVar328);
  fVar208 = fVar208 + fVar208 * auVar101._0_4_;
  fVar224 = fVar224 + fVar224 * auVar101._4_4_;
  fVar225 = fVar225 + fVar225 * auVar101._8_4_;
  fVar226 = fVar226 + fVar226 * auVar101._12_4_;
  fVar227 = fVar227 + fVar227 * auVar101._16_4_;
  fVar229 = fVar229 + fVar229 * auVar101._20_4_;
  fVar231 = fVar231 + fVar231 * auVar101._24_4_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar90 * 7 + 6);
  auVar132 = vpmovsxwd_avx(auVar132);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar90 * 7 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar102._16_16_ = auVar17;
  auVar102._0_16_ = auVar132;
  auVar101 = vcvtdq2ps_avx(auVar102);
  auVar101 = vsubps_avx(auVar101,auVar271);
  auVar92._0_4_ = fVar177 * auVar101._0_4_;
  auVar92._4_4_ = fVar202 * auVar101._4_4_;
  auVar92._8_4_ = fVar203 * auVar101._8_4_;
  auVar92._12_4_ = fVar204 * auVar101._12_4_;
  auVar13._16_4_ = fVar205 * auVar101._16_4_;
  auVar13._0_16_ = auVar92;
  auVar13._20_4_ = fVar206 * auVar101._20_4_;
  auVar13._24_4_ = fVar207 * auVar101._24_4_;
  auVar13._28_4_ = auVar101._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar12 + 6);
  auVar132 = vpmovsxwd_avx(auVar24);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + lVar12 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar3);
  auVar304._16_16_ = auVar17;
  auVar304._0_16_ = auVar132;
  auVar101 = vcvtdq2ps_avx(auVar304);
  auVar101 = vsubps_avx(auVar101,auVar271);
  auVar178._0_4_ = fVar177 * auVar101._0_4_;
  auVar178._4_4_ = fVar202 * auVar101._4_4_;
  auVar178._8_4_ = fVar203 * auVar101._8_4_;
  auVar178._12_4_ = fVar204 * auVar101._12_4_;
  auVar15._16_4_ = fVar205 * auVar101._16_4_;
  auVar15._0_16_ = auVar178;
  auVar15._20_4_ = fVar206 * auVar101._20_4_;
  auVar15._24_4_ = fVar207 * auVar101._24_4_;
  auVar15._28_4_ = auVar14._28_4_ + auVar340._28_4_;
  lVar89 = (ulong)(byte)PVar7 * 0x10;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar89 + 6);
  auVar132 = vpmovsxwd_avx(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar89 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar5);
  lVar89 = lVar89 + uVar90 * -2;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + lVar89 + 6);
  auVar24 = vpmovsxwd_avx(auVar237);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + lVar89 + 0xe);
  auVar3 = vpmovsxwd_avx(auVar190);
  auVar272._16_16_ = auVar3;
  auVar272._0_16_ = auVar24;
  auVar101 = vcvtdq2ps_avx(auVar272);
  auVar101 = vsubps_avx(auVar101,auVar143);
  auVar267._0_4_ = fVar233 * auVar101._0_4_;
  auVar267._4_4_ = fVar252 * auVar101._4_4_;
  auVar267._8_4_ = fVar254 * auVar101._8_4_;
  auVar267._12_4_ = fVar256 * auVar101._12_4_;
  auVar14._16_4_ = fVar258 * auVar101._16_4_;
  auVar14._0_16_ = auVar267;
  auVar14._20_4_ = fVar260 * auVar101._20_4_;
  auVar14._24_4_ = fVar262 * auVar101._24_4_;
  auVar14._28_4_ = auVar101._28_4_;
  auVar305._16_16_ = auVar17;
  auVar305._0_16_ = auVar132;
  auVar101 = vcvtdq2ps_avx(auVar305);
  auVar101 = vsubps_avx(auVar101,auVar143);
  auVar131._0_4_ = fVar233 * auVar101._0_4_;
  auVar131._4_4_ = fVar252 * auVar101._4_4_;
  auVar131._8_4_ = fVar254 * auVar101._8_4_;
  auVar131._12_4_ = fVar256 * auVar101._12_4_;
  auVar16._16_4_ = fVar258 * auVar101._16_4_;
  auVar16._0_16_ = auVar131;
  auVar16._20_4_ = fVar260 * auVar101._20_4_;
  auVar16._24_4_ = fVar262 * auVar101._24_4_;
  auVar16._28_4_ = auVar101._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar86 + uVar90 + 6);
  auVar132 = vpmovsxwd_avx(auVar6);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar86 + uVar90 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar98);
  auVar243._16_16_ = auVar17;
  auVar243._0_16_ = auVar132;
  auVar101 = vcvtdq2ps_avx(auVar243);
  auVar101 = vsubps_avx(auVar101,auVar165);
  auVar236._0_4_ = fVar208 * auVar101._0_4_;
  auVar236._4_4_ = fVar224 * auVar101._4_4_;
  auVar236._8_4_ = fVar225 * auVar101._8_4_;
  auVar236._12_4_ = fVar226 * auVar101._12_4_;
  auVar25._16_4_ = fVar227 * auVar101._16_4_;
  auVar25._0_16_ = auVar236;
  auVar25._20_4_ = fVar229 * auVar101._20_4_;
  auVar25._24_4_ = fVar231 * auVar101._24_4_;
  auVar25._28_4_ = auVar101._28_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar90 * 0x17 + 6);
  auVar132 = vpmovsxwd_avx(auVar161);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar90 * 0x17 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar187);
  auVar306._16_16_ = auVar17;
  auVar306._0_16_ = auVar132;
  auVar101 = vcvtdq2ps_avx(auVar306);
  auVar101 = vsubps_avx(auVar101,auVar165);
  auVar100._0_4_ = fVar208 * auVar101._0_4_;
  auVar100._4_4_ = fVar224 * auVar101._4_4_;
  auVar100._8_4_ = fVar225 * auVar101._8_4_;
  auVar100._12_4_ = fVar226 * auVar101._12_4_;
  auVar26._16_4_ = fVar227 * auVar101._16_4_;
  auVar26._0_16_ = auVar100;
  auVar26._20_4_ = fVar229 * auVar101._20_4_;
  auVar26._24_4_ = fVar231 * auVar101._24_4_;
  auVar26._28_4_ = auVar101._28_4_;
  auVar132 = vpminsd_avx(auVar13._16_16_,auVar15._16_16_);
  auVar17 = vpminsd_avx(auVar92,auVar178);
  auVar326._16_16_ = auVar132;
  auVar326._0_16_ = auVar17;
  auVar132 = vpminsd_avx(auVar14._16_16_,auVar16._16_16_);
  auVar17 = vpminsd_avx(auVar267,auVar131);
  auVar359._16_16_ = auVar132;
  auVar359._0_16_ = auVar17;
  auVar101 = vmaxps_avx(auVar326,auVar359);
  auVar132 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar17 = vpminsd_avx(auVar236,auVar100);
  auVar381._16_16_ = auVar132;
  auVar381._0_16_ = auVar17;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar393._4_4_ = uVar1;
  auVar393._0_4_ = uVar1;
  auVar393._8_4_ = uVar1;
  auVar393._12_4_ = uVar1;
  auVar393._16_4_ = uVar1;
  auVar393._20_4_ = uVar1;
  auVar393._24_4_ = uVar1;
  auVar393._28_4_ = uVar1;
  auVar155 = vmaxps_avx(auVar381,auVar393);
  auVar101 = vmaxps_avx(auVar101,auVar155);
  local_320._4_4_ = auVar101._4_4_ * 0.99999964;
  local_320._0_4_ = auVar101._0_4_ * 0.99999964;
  local_320._8_4_ = auVar101._8_4_ * 0.99999964;
  local_320._12_4_ = auVar101._12_4_ * 0.99999964;
  local_320._16_4_ = auVar101._16_4_ * 0.99999964;
  local_320._20_4_ = auVar101._20_4_ * 0.99999964;
  local_320._24_4_ = auVar101._24_4_ * 0.99999964;
  local_320._28_4_ = auVar101._28_4_;
  auVar132 = vpmaxsd_avx(auVar13._16_16_,auVar15._16_16_);
  auVar17 = vpmaxsd_avx(auVar92,auVar178);
  auVar103._16_16_ = auVar132;
  auVar103._0_16_ = auVar17;
  auVar132 = vpmaxsd_avx(auVar14._16_16_,auVar16._16_16_);
  auVar17 = vpmaxsd_avx(auVar267,auVar131);
  auVar144._16_16_ = auVar132;
  auVar144._0_16_ = auVar17;
  auVar101 = vminps_avx(auVar103,auVar144);
  auVar132 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar17 = vpmaxsd_avx(auVar236,auVar100);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar196._4_4_ = uVar1;
  auVar196._0_4_ = uVar1;
  auVar196._8_4_ = uVar1;
  auVar196._12_4_ = uVar1;
  auVar196._16_4_ = uVar1;
  auVar196._20_4_ = uVar1;
  auVar196._24_4_ = uVar1;
  auVar196._28_4_ = uVar1;
  auVar145._16_16_ = auVar132;
  auVar145._0_16_ = auVar17;
  auVar155 = vminps_avx(auVar145,auVar196);
  auVar101 = vminps_avx(auVar101,auVar155);
  auVar155._4_4_ = auVar101._4_4_ * 1.0000004;
  auVar155._0_4_ = auVar101._0_4_ * 1.0000004;
  auVar155._8_4_ = auVar101._8_4_ * 1.0000004;
  auVar155._12_4_ = auVar101._12_4_ * 1.0000004;
  auVar155._16_4_ = auVar101._16_4_ * 1.0000004;
  auVar155._20_4_ = auVar101._20_4_ * 1.0000004;
  auVar155._24_4_ = auVar101._24_4_ * 1.0000004;
  auVar155._28_4_ = auVar101._28_4_;
  auVar101 = vcmpps_avx(local_320,auVar155,2);
  auVar132 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar146._16_16_ = auVar132;
  auVar146._0_16_ = auVar132;
  auVar155 = vcvtdq2ps_avx(auVar146);
  auVar155 = vcmpps_avx(_DAT_01faff40,auVar155,1);
  auVar101 = vandps_avx(auVar101,auVar155);
  uVar83 = vmovmskps_avx(auVar101);
  if (uVar83 == 0) {
    return;
  }
  uVar83 = uVar83 & 0xff;
  local_8a8 = prim + lVar77 + 0x16;
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  local_a30 = &local_520;
  uVar88 = 1 << ((byte)k & 0x1f);
  local_a38 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
  local_a40 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
  local_a28 = prim;
LAB_00fecc15:
  uVar90 = (ulong)uVar83;
  lVar89 = 0;
  if (uVar90 != 0) {
    for (; (uVar83 >> lVar89 & 1) == 0; lVar89 = lVar89 + 1) {
    }
  }
  uVar90 = uVar90 - 1 & uVar90;
  uVar83 = *(uint *)(local_a28 + lVar89 * 4 + 6);
  lVar89 = lVar89 * 0x40;
  lVar12 = 0;
  if (uVar90 != 0) {
    for (; (uVar90 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  uVar88 = *(uint *)(local_a28 + 2);
  auVar132 = *(undefined1 (*) [16])(local_8a8 + lVar89);
  if (((uVar90 != 0) && (uVar86 = uVar90 - 1 & uVar90, uVar86 != 0)) && (lVar12 = 0, uVar86 != 0)) {
    for (; (uVar86 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar17 = *(undefined1 (*) [16])(local_8a8 + lVar89 + 0x10);
  auVar24 = *(undefined1 (*) [16])(local_8a8 + lVar89 + 0x20);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar177 = *(float *)(ray + k * 4 + 0x80);
  auVar350._4_4_ = fVar177;
  auVar350._0_4_ = fVar177;
  auVar350._8_4_ = fVar177;
  auVar350._12_4_ = fVar177;
  fStack_7f0 = fVar177;
  _local_800 = auVar350;
  fStack_7ec = fVar177;
  fStack_7e8 = fVar177;
  fStack_7e4 = fVar177;
  auVar3 = *(undefined1 (*) [16])(local_8a8 + lVar89 + 0x30);
  fVar202 = *(float *)(ray + k * 4 + 0xa0);
  auVar380._4_4_ = fVar202;
  auVar380._0_4_ = fVar202;
  auVar380._8_4_ = fVar202;
  auVar380._12_4_ = fVar202;
  fStack_810 = fVar202;
  _local_820 = auVar380;
  fStack_80c = fVar202;
  fStack_808 = fVar202;
  fStack_804 = fVar202;
  auVar4 = vunpcklps_avx(auVar350,auVar380);
  fVar203 = *(float *)(ray + k * 4 + 0xc0);
  auVar398._4_4_ = fVar203;
  auVar398._0_4_ = fVar203;
  auVar398._8_4_ = fVar203;
  auVar398._12_4_ = fVar203;
  fStack_7d0 = fVar203;
  _local_7e0 = auVar398;
  fStack_7cc = fVar203;
  fStack_7c8 = fVar203;
  fStack_7c4 = fVar203;
  _local_970 = vinsertps_avx(auVar4,auVar398,0x28);
  auVar93._0_4_ = (auVar132._0_4_ + auVar17._0_4_ + auVar24._0_4_ + auVar3._0_4_) * 0.25;
  auVar93._4_4_ = (auVar132._4_4_ + auVar17._4_4_ + auVar24._4_4_ + auVar3._4_4_) * 0.25;
  auVar93._8_4_ = (auVar132._8_4_ + auVar17._8_4_ + auVar24._8_4_ + auVar3._8_4_) * 0.25;
  auVar93._12_4_ = (auVar132._12_4_ + auVar17._12_4_ + auVar24._12_4_ + auVar3._12_4_) * 0.25;
  auVar4 = vsubps_avx(auVar93,auVar5);
  auVar4 = vdpps_avx(auVar4,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar237 = vrcpss_avx(local_980,local_980);
  fVar204 = auVar4._0_4_ * auVar237._0_4_ * (2.0 - local_980._0_4_ * auVar237._0_4_);
  auVar237 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
  auVar209._0_4_ = auVar5._0_4_ + local_970._0_4_ * auVar237._0_4_;
  auVar209._4_4_ = auVar5._4_4_ + local_970._4_4_ * auVar237._4_4_;
  auVar209._8_4_ = auVar5._8_4_ + local_970._8_4_ * auVar237._8_4_;
  auVar209._12_4_ = auVar5._12_4_ + local_970._12_4_ * auVar237._12_4_;
  auVar4 = vblendps_avx(auVar209,_DAT_01f7aa10,8);
  _local_ae0 = vsubps_avx(auVar132,auVar4);
  _local_af0 = vsubps_avx(auVar24,auVar4);
  _local_b00 = vsubps_avx(auVar17,auVar4);
  _local_b10 = vsubps_avx(auVar3,auVar4);
  auVar17 = vshufps_avx(_local_ae0,_local_ae0,0);
  auVar132 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  local_a60._16_16_ = auVar132;
  local_a60._0_16_ = auVar132;
  auVar362 = ZEXT3264(local_a60);
  auVar24 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  auVar3 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  auVar132 = vshufps_avx(_local_b00,_local_b00,0);
  auVar244._16_16_ = auVar132;
  auVar244._0_16_ = auVar132;
  auVar4 = vshufps_avx(_local_b00,_local_b00,0x55);
  auVar132 = vshufps_avx(_local_b00,_local_b00,0xaa);
  local_a80._16_16_ = auVar132;
  local_a80._0_16_ = auVar132;
  auVar281 = ZEXT3264(local_a80);
  auVar132 = vshufps_avx(_local_b00,_local_b00,0xff);
  local_840._16_16_ = auVar132;
  local_840._0_16_ = auVar132;
  auVar402 = ZEXT3264(local_840);
  auVar132 = vshufps_avx(_local_af0,_local_af0,0);
  local_2c0._16_16_ = auVar132;
  local_2c0._0_16_ = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0x55);
  local_2e0._16_16_ = auVar132;
  local_2e0._0_16_ = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar132;
  _local_1e0 = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar132;
  _local_200 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar132;
  _local_220 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar132;
  _local_240 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar132;
  _local_260 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar132;
  _local_280 = auVar132;
  auVar132 = ZEXT416((uint)(fVar177 * fVar177 + fVar202 * fVar202 + fVar203 * fVar203));
  auVar132 = vshufps_avx(auVar132,auVar132,0);
  local_2a0._16_16_ = auVar132;
  local_2a0._0_16_ = auVar132;
  fVar177 = *(float *)(ray + k * 4 + 0x60);
  local_8c0 = ZEXT416((uint)fVar204);
  auVar132 = vshufps_avx(ZEXT416((uint)(fVar177 - fVar204)),ZEXT416((uint)(fVar177 - fVar204)),0);
  local_300._16_16_ = auVar132;
  local_300._0_16_ = auVar132;
  auVar132 = vpshufd_avx(ZEXT416(uVar88),0);
  local_480._16_16_ = auVar132;
  local_480._0_16_ = auVar132;
  auVar132 = vpshufd_avx(ZEXT416(uVar83),0);
  local_4a0._16_16_ = auVar132;
  local_4a0._0_16_ = auVar132;
  local_cc0 = auVar237._0_8_;
  uStack_cb8 = auVar237._8_8_;
  local_900 = local_cc0;
  uStack_8f8 = uStack_cb8;
  uStack_8f0 = local_cc0;
  uStack_8e8 = uStack_cb8;
  local_cc8 = 1;
  uVar86 = 0;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_2a0,auVar105);
  auVar132 = vsqrtss_avx(local_980,local_980);
  auVar5 = vsqrtss_avx(local_980,local_980);
  local_610 = ZEXT816(0x3f80000000000000);
  local_440 = auVar244;
  do {
    auVar197._8_4_ = 0x3f800000;
    auVar197._0_8_ = 0x3f8000003f800000;
    auVar197._12_4_ = 0x3f800000;
    auVar197._16_4_ = 0x3f800000;
    auVar197._20_4_ = 0x3f800000;
    iVar87 = (int)uVar86;
    auVar197._24_4_ = 0x3f800000;
    auVar197._28_4_ = 0x3f800000;
    auVar237 = vmovshdup_avx(local_610);
    auVar6 = vsubps_avx(auVar237,local_610);
    auVar237 = vshufps_avx(local_610,local_610,0);
    local_7a0._16_16_ = auVar237;
    local_7a0._0_16_ = auVar237;
    auVar190 = vshufps_avx(auVar6,auVar6,0);
    local_7c0._16_16_ = auVar190;
    local_7c0._0_16_ = auVar190;
    fVar129 = auVar190._0_4_;
    fVar156 = auVar190._4_4_;
    fVar157 = auVar190._8_4_;
    fVar158 = auVar190._12_4_;
    fVar91 = auVar237._0_4_;
    auVar147._0_4_ = fVar91 + fVar129 * 0.0;
    fVar120 = auVar237._4_4_;
    auVar147._4_4_ = fVar120 + fVar156 * 0.14285715;
    fVar122 = auVar237._8_4_;
    auVar147._8_4_ = fVar122 + fVar157 * 0.2857143;
    fVar124 = auVar237._12_4_;
    auVar147._12_4_ = fVar124 + fVar158 * 0.42857146;
    auVar147._16_4_ = fVar91 + fVar129 * 0.5714286;
    auVar147._20_4_ = fVar120 + fVar156 * 0.71428573;
    auVar147._24_4_ = fVar122 + fVar157 * 0.8571429;
    auVar147._28_4_ = fVar124 + fVar158;
    auVar101 = vsubps_avx(auVar197,auVar147);
    fVar322 = auVar4._0_4_;
    fVar332 = auVar4._4_4_;
    fVar333 = auVar4._8_4_;
    fVar334 = auVar4._12_4_;
    fVar224 = auVar244._28_4_;
    fVar202 = auVar101._0_4_;
    fVar203 = auVar101._4_4_;
    fVar204 = auVar101._8_4_;
    fVar205 = auVar101._12_4_;
    fVar206 = auVar101._16_4_;
    fVar207 = auVar101._20_4_;
    fVar208 = auVar101._24_4_;
    fVar254 = auVar281._28_4_ + fVar224 + 2.0;
    fVar264 = local_2c0._0_4_ * auVar147._0_4_ + auVar244._0_4_ * fVar202;
    fVar282 = local_2c0._4_4_ * auVar147._4_4_ + auVar244._4_4_ * fVar203;
    fVar285 = local_2c0._8_4_ * auVar147._8_4_ + auVar244._8_4_ * fVar204;
    fVar288 = local_2c0._12_4_ * auVar147._12_4_ + auVar244._12_4_ * fVar205;
    fVar291 = local_2c0._16_4_ * auVar147._16_4_ + auVar244._16_4_ * fVar206;
    fVar294 = local_2c0._20_4_ * auVar147._20_4_ + auVar244._20_4_ * fVar207;
    fVar297 = local_2c0._24_4_ * auVar147._24_4_ + auVar244._24_4_ * fVar208;
    fVar225 = local_2e0._0_4_ * auVar147._0_4_ + fVar322 * fVar202;
    fVar226 = local_2e0._4_4_ * auVar147._4_4_ + fVar332 * fVar203;
    fVar227 = local_2e0._8_4_ * auVar147._8_4_ + fVar333 * fVar204;
    fVar229 = local_2e0._12_4_ * auVar147._12_4_ + fVar334 * fVar205;
    fVar231 = local_2e0._16_4_ * auVar147._16_4_ + fVar322 * fVar206;
    fVar233 = local_2e0._20_4_ * auVar147._20_4_ + fVar332 * fVar207;
    fVar252 = local_2e0._24_4_ * auVar147._24_4_ + fVar333 * fVar208;
    fVar256 = (float)local_1e0._0_4_ * auVar147._0_4_ + auVar281._0_4_ * fVar202;
    fVar258 = (float)local_1e0._4_4_ * auVar147._4_4_ + auVar281._4_4_ * fVar203;
    fVar260 = fStack_1d8 * auVar147._8_4_ + auVar281._8_4_ * fVar204;
    fVar262 = fStack_1d4 * auVar147._12_4_ + auVar281._12_4_ * fVar205;
    fVar228 = fStack_1d0 * auVar147._16_4_ + auVar281._16_4_ * fVar206;
    fVar230 = fStack_1cc * auVar147._20_4_ + auVar281._20_4_ * fVar207;
    fVar232 = fStack_1c8 * auVar147._24_4_ + auVar281._24_4_ * fVar208;
    fVar234 = (float)local_200._0_4_ * auVar147._0_4_ + auVar402._0_4_ * fVar202;
    fVar253 = (float)local_200._4_4_ * auVar147._4_4_ + auVar402._4_4_ * fVar203;
    fVar255 = fStack_1f8 * auVar147._8_4_ + auVar402._8_4_ * fVar204;
    fVar257 = fStack_1f4 * auVar147._12_4_ + auVar402._12_4_ * fVar205;
    fVar259 = fStack_1f0 * auVar147._16_4_ + auVar402._16_4_ * fVar206;
    fVar261 = fStack_1ec * auVar147._20_4_ + auVar402._20_4_ * fVar207;
    fVar263 = fStack_1e8 * auVar147._24_4_ + auVar402._24_4_ * fVar208;
    fVar369 = auVar362._28_4_;
    fVar392 = fVar369 + local_2c0._28_4_;
    fVar378 = auVar402._28_4_ + fVar369;
    auVar338._0_4_ =
         fVar202 * (auVar244._0_4_ * auVar147._0_4_ + auVar17._0_4_ * fVar202) +
         auVar147._0_4_ * fVar264;
    auVar338._4_4_ =
         fVar203 * (auVar244._4_4_ * auVar147._4_4_ + auVar17._4_4_ * fVar203) +
         auVar147._4_4_ * fVar282;
    auVar338._8_4_ =
         fVar204 * (auVar244._8_4_ * auVar147._8_4_ + auVar17._8_4_ * fVar204) +
         auVar147._8_4_ * fVar285;
    auVar338._12_4_ =
         fVar205 * (auVar244._12_4_ * auVar147._12_4_ + auVar17._12_4_ * fVar205) +
         auVar147._12_4_ * fVar288;
    auVar338._16_4_ =
         fVar206 * (auVar244._16_4_ * auVar147._16_4_ + auVar17._0_4_ * fVar206) +
         auVar147._16_4_ * fVar291;
    auVar338._20_4_ =
         fVar207 * (auVar244._20_4_ * auVar147._20_4_ + auVar17._4_4_ * fVar207) +
         auVar147._20_4_ * fVar294;
    auVar338._24_4_ =
         fVar208 * (auVar244._24_4_ * auVar147._24_4_ + auVar17._8_4_ * fVar208) +
         auVar147._24_4_ * fVar297;
    auVar338._28_4_ = fStack_1c4 + fVar369;
    auVar352._0_4_ =
         fVar202 * (fVar322 * auVar147._0_4_ + auVar362._0_4_ * fVar202) + auVar147._0_4_ * fVar225;
    auVar352._4_4_ =
         fVar203 * (fVar332 * auVar147._4_4_ + auVar362._4_4_ * fVar203) + auVar147._4_4_ * fVar226;
    auVar352._8_4_ =
         fVar204 * (fVar333 * auVar147._8_4_ + auVar362._8_4_ * fVar204) + auVar147._8_4_ * fVar227;
    auVar352._12_4_ =
         fVar205 * (fVar334 * auVar147._12_4_ + auVar362._12_4_ * fVar205) +
         auVar147._12_4_ * fVar229;
    auVar352._16_4_ =
         fVar206 * (fVar322 * auVar147._16_4_ + auVar362._16_4_ * fVar206) +
         auVar147._16_4_ * fVar231;
    auVar352._20_4_ =
         fVar207 * (fVar332 * auVar147._20_4_ + auVar362._20_4_ * fVar207) +
         auVar147._20_4_ * fVar233;
    auVar352._24_4_ =
         fVar208 * (fVar333 * auVar147._24_4_ + auVar362._24_4_ * fVar208) +
         auVar147._24_4_ * fVar252;
    auVar352._28_4_ = fStack_1e4 + fVar369;
    auVar360._0_4_ =
         fVar202 * (auVar281._0_4_ * auVar147._0_4_ + auVar24._0_4_ * fVar202) +
         auVar147._0_4_ * fVar256;
    auVar360._4_4_ =
         fVar203 * (auVar281._4_4_ * auVar147._4_4_ + auVar24._4_4_ * fVar203) +
         auVar147._4_4_ * fVar258;
    auVar360._8_4_ =
         fVar204 * (auVar281._8_4_ * auVar147._8_4_ + auVar24._8_4_ * fVar204) +
         auVar147._8_4_ * fVar260;
    auVar360._12_4_ =
         fVar205 * (auVar281._12_4_ * auVar147._12_4_ + auVar24._12_4_ * fVar205) +
         auVar147._12_4_ * fVar262;
    auVar360._16_4_ =
         fVar206 * (auVar281._16_4_ * auVar147._16_4_ + auVar24._0_4_ * fVar206) +
         auVar147._16_4_ * fVar228;
    auVar360._20_4_ =
         fVar207 * (auVar281._20_4_ * auVar147._20_4_ + auVar24._4_4_ * fVar207) +
         auVar147._20_4_ * fVar230;
    auVar360._24_4_ =
         fVar208 * (auVar281._24_4_ * auVar147._24_4_ + auVar24._8_4_ * fVar208) +
         auVar147._24_4_ * fVar232;
    auVar360._28_4_ = fVar334 + fVar369;
    auVar307._0_4_ =
         auVar147._0_4_ * fVar234 +
         fVar202 * (auVar402._0_4_ * auVar147._0_4_ + auVar3._0_4_ * fVar202);
    auVar307._4_4_ =
         auVar147._4_4_ * fVar253 +
         fVar203 * (auVar402._4_4_ * auVar147._4_4_ + auVar3._4_4_ * fVar203);
    auVar307._8_4_ =
         auVar147._8_4_ * fVar255 +
         fVar204 * (auVar402._8_4_ * auVar147._8_4_ + auVar3._8_4_ * fVar204);
    auVar307._12_4_ =
         auVar147._12_4_ * fVar257 +
         fVar205 * (auVar402._12_4_ * auVar147._12_4_ + auVar3._12_4_ * fVar205);
    auVar307._16_4_ =
         auVar147._16_4_ * fVar259 +
         fVar206 * (auVar402._16_4_ * auVar147._16_4_ + auVar3._0_4_ * fVar206);
    auVar307._20_4_ =
         auVar147._20_4_ * fVar261 +
         fVar207 * (auVar402._20_4_ * auVar147._20_4_ + auVar3._4_4_ * fVar207);
    auVar307._24_4_ =
         auVar147._24_4_ * fVar263 +
         fVar208 * (auVar402._24_4_ * auVar147._24_4_ + auVar3._8_4_ * fVar208);
    auVar307._28_4_ = fVar334 + auVar17._12_4_ + 1.0;
    auVar273._0_4_ =
         (auVar147._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar202) * auVar147._0_4_ +
         fVar202 * fVar264;
    auVar273._4_4_ =
         (auVar147._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar203) * auVar147._4_4_ +
         fVar203 * fVar282;
    auVar273._8_4_ =
         (auVar147._8_4_ * fStack_218 + local_2c0._8_4_ * fVar204) * auVar147._8_4_ +
         fVar204 * fVar285;
    auVar273._12_4_ =
         (auVar147._12_4_ * fStack_214 + local_2c0._12_4_ * fVar205) * auVar147._12_4_ +
         fVar205 * fVar288;
    auVar273._16_4_ =
         (auVar147._16_4_ * fStack_210 + local_2c0._16_4_ * fVar206) * auVar147._16_4_ +
         fVar206 * fVar291;
    auVar273._20_4_ =
         (auVar147._20_4_ * fStack_20c + local_2c0._20_4_ * fVar207) * auVar147._20_4_ +
         fVar207 * fVar294;
    auVar273._24_4_ =
         (auVar147._24_4_ * fStack_208 + local_2c0._24_4_ * fVar208) * auVar147._24_4_ +
         fVar208 * fVar297;
    auVar273._28_4_ = fVar334 + fVar254 + auVar281._28_4_;
    auVar198._0_4_ =
         (auVar147._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar202) * auVar147._0_4_ +
         fVar202 * fVar225;
    auVar198._4_4_ =
         (auVar147._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar203) * auVar147._4_4_ +
         fVar203 * fVar226;
    auVar198._8_4_ =
         (auVar147._8_4_ * fStack_238 + local_2e0._8_4_ * fVar204) * auVar147._8_4_ +
         fVar204 * fVar227;
    auVar198._12_4_ =
         (auVar147._12_4_ * fStack_234 + local_2e0._12_4_ * fVar205) * auVar147._12_4_ +
         fVar205 * fVar229;
    auVar198._16_4_ =
         (auVar147._16_4_ * fStack_230 + local_2e0._16_4_ * fVar206) * auVar147._16_4_ +
         fVar206 * fVar231;
    auVar198._20_4_ =
         (auVar147._20_4_ * fStack_22c + local_2e0._20_4_ * fVar207) * auVar147._20_4_ +
         fVar207 * fVar233;
    auVar198._24_4_ =
         (auVar147._24_4_ * fStack_228 + local_2e0._24_4_ * fVar208) * auVar147._24_4_ +
         fVar208 * fVar252;
    auVar198._28_4_ = fVar334 + fVar254 + 1.0;
    auVar219._0_4_ =
         (auVar147._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar202) *
         auVar147._0_4_ + fVar202 * fVar256;
    auVar219._4_4_ =
         (auVar147._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar203) *
         auVar147._4_4_ + fVar203 * fVar258;
    auVar219._8_4_ =
         (auVar147._8_4_ * fStack_258 + fStack_1d8 * fVar204) * auVar147._8_4_ + fVar204 * fVar260;
    auVar219._12_4_ =
         (auVar147._12_4_ * fStack_254 + fStack_1d4 * fVar205) * auVar147._12_4_ + fVar205 * fVar262
    ;
    auVar219._16_4_ =
         (auVar147._16_4_ * fStack_250 + fStack_1d0 * fVar206) * auVar147._16_4_ + fVar206 * fVar228
    ;
    auVar219._20_4_ =
         (auVar147._20_4_ * fStack_24c + fStack_1cc * fVar207) * auVar147._20_4_ + fVar207 * fVar230
    ;
    auVar219._24_4_ =
         (auVar147._24_4_ * fStack_248 + fStack_1c8 * fVar208) * auVar147._24_4_ + fVar208 * fVar232
    ;
    auVar219._28_4_ = fVar378 + fVar224 + 1.0;
    auVar245._0_4_ =
         (auVar147._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar202) *
         auVar147._0_4_ + fVar202 * fVar234;
    auVar245._4_4_ =
         (auVar147._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar203) *
         auVar147._4_4_ + fVar203 * fVar253;
    auVar245._8_4_ =
         (auVar147._8_4_ * fStack_278 + fStack_1f8 * fVar204) * auVar147._8_4_ + fVar204 * fVar255;
    auVar245._12_4_ =
         (auVar147._12_4_ * fStack_274 + fStack_1f4 * fVar205) * auVar147._12_4_ + fVar205 * fVar257
    ;
    auVar245._16_4_ =
         (auVar147._16_4_ * fStack_270 + fStack_1f0 * fVar206) * auVar147._16_4_ + fVar206 * fVar259
    ;
    auVar245._20_4_ =
         (auVar147._20_4_ * fStack_26c + fStack_1ec * fVar207) * auVar147._20_4_ + fVar207 * fVar261
    ;
    auVar245._24_4_ =
         (auVar147._24_4_ * fStack_268 + fStack_1e8 * fVar208) * auVar147._24_4_ + fVar208 * fVar263
    ;
    auVar245._28_4_ = fVar392 + fVar369 + fVar224;
    auVar382._0_4_ = auVar338._0_4_ * fVar202 + auVar147._0_4_ * auVar273._0_4_;
    auVar382._4_4_ = auVar338._4_4_ * fVar203 + auVar147._4_4_ * auVar273._4_4_;
    auVar382._8_4_ = auVar338._8_4_ * fVar204 + auVar147._8_4_ * auVar273._8_4_;
    auVar382._12_4_ = auVar338._12_4_ * fVar205 + auVar147._12_4_ * auVar273._12_4_;
    auVar382._16_4_ = auVar338._16_4_ * fVar206 + auVar147._16_4_ * auVar273._16_4_;
    auVar382._20_4_ = auVar338._20_4_ * fVar207 + auVar147._20_4_ * auVar273._20_4_;
    auVar382._24_4_ = auVar338._24_4_ * fVar208 + auVar147._24_4_ * auVar273._24_4_;
    auVar382._28_4_ = fVar392 + fVar334;
    auVar394._0_4_ = auVar352._0_4_ * fVar202 + auVar147._0_4_ * auVar198._0_4_;
    auVar394._4_4_ = auVar352._4_4_ * fVar203 + auVar147._4_4_ * auVar198._4_4_;
    auVar394._8_4_ = auVar352._8_4_ * fVar204 + auVar147._8_4_ * auVar198._8_4_;
    auVar394._12_4_ = auVar352._12_4_ * fVar205 + auVar147._12_4_ * auVar198._12_4_;
    auVar394._16_4_ = auVar352._16_4_ * fVar206 + auVar147._16_4_ * auVar198._16_4_;
    auVar394._20_4_ = auVar352._20_4_ * fVar207 + auVar147._20_4_ * auVar198._20_4_;
    auVar394._24_4_ = auVar352._24_4_ * fVar208 + auVar147._24_4_ * auVar198._24_4_;
    auVar394._28_4_ = fVar334 + fVar378;
    auVar399._0_4_ = auVar360._0_4_ * fVar202 + auVar147._0_4_ * auVar219._0_4_;
    auVar399._4_4_ = auVar360._4_4_ * fVar203 + auVar147._4_4_ * auVar219._4_4_;
    auVar399._8_4_ = auVar360._8_4_ * fVar204 + auVar147._8_4_ * auVar219._8_4_;
    auVar399._12_4_ = auVar360._12_4_ * fVar205 + auVar147._12_4_ * auVar219._12_4_;
    auVar399._16_4_ = auVar360._16_4_ * fVar206 + auVar147._16_4_ * auVar219._16_4_;
    auVar399._20_4_ = auVar360._20_4_ * fVar207 + auVar147._20_4_ * auVar219._20_4_;
    auVar399._24_4_ = auVar360._24_4_ * fVar208 + auVar147._24_4_ * auVar219._24_4_;
    auVar399._28_4_ = fVar378 + fVar334;
    local_ca0._0_4_ = auVar6._0_4_;
    auVar327._0_4_ = fVar202 * auVar307._0_4_ + auVar147._0_4_ * auVar245._0_4_;
    auVar327._4_4_ = fVar203 * auVar307._4_4_ + auVar147._4_4_ * auVar245._4_4_;
    auVar327._8_4_ = fVar204 * auVar307._8_4_ + auVar147._8_4_ * auVar245._8_4_;
    auVar327._12_4_ = fVar205 * auVar307._12_4_ + auVar147._12_4_ * auVar245._12_4_;
    auVar327._16_4_ = fVar206 * auVar307._16_4_ + auVar147._16_4_ * auVar245._16_4_;
    auVar327._20_4_ = fVar207 * auVar307._20_4_ + auVar147._20_4_ * auVar245._20_4_;
    auVar327._24_4_ = fVar208 * auVar307._24_4_ + auVar147._24_4_ * auVar245._24_4_;
    auVar327._28_4_ = auVar101._28_4_ + auVar147._28_4_;
    auVar101 = vsubps_avx(auVar273,auVar338);
    auVar155 = vsubps_avx(auVar198,auVar352);
    auVar13 = vsubps_avx(auVar219,auVar360);
    auVar14 = vsubps_avx(auVar245,auVar307);
    auVar237 = vshufps_avx(ZEXT416((uint)((float)local_ca0._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_ca0._0_4_ * 0.04761905)),0);
    fVar207 = auVar237._0_4_;
    fVar265 = fVar207 * auVar101._0_4_ * 3.0;
    fVar224 = auVar237._4_4_;
    fVar283 = fVar224 * auVar101._4_4_ * 3.0;
    auVar27._4_4_ = fVar283;
    auVar27._0_4_ = fVar265;
    fVar233 = auVar237._8_4_;
    fVar286 = fVar233 * auVar101._8_4_ * 3.0;
    auVar27._8_4_ = fVar286;
    fVar262 = auVar237._12_4_;
    fVar289 = fVar262 * auVar101._12_4_ * 3.0;
    auVar27._12_4_ = fVar289;
    fVar292 = fVar207 * auVar101._16_4_ * 3.0;
    auVar27._16_4_ = fVar292;
    fVar295 = fVar224 * auVar101._20_4_ * 3.0;
    auVar27._20_4_ = fVar295;
    fVar298 = fVar233 * auVar101._24_4_ * 3.0;
    auVar27._24_4_ = fVar298;
    auVar27._28_4_ = auVar273._28_4_;
    fVar300 = fVar207 * auVar155._0_4_ * 3.0;
    fVar311 = fVar224 * auVar155._4_4_ * 3.0;
    auVar28._4_4_ = fVar311;
    auVar28._0_4_ = fVar300;
    fVar312 = fVar233 * auVar155._8_4_ * 3.0;
    auVar28._8_4_ = fVar312;
    fVar314 = fVar262 * auVar155._12_4_ * 3.0;
    auVar28._12_4_ = fVar314;
    fVar316 = fVar207 * auVar155._16_4_ * 3.0;
    auVar28._16_4_ = fVar316;
    fVar318 = fVar224 * auVar155._20_4_ * 3.0;
    auVar28._20_4_ = fVar318;
    fVar320 = fVar233 * auVar155._24_4_ * 3.0;
    auVar28._24_4_ = fVar320;
    auVar28._28_4_ = auVar307._28_4_;
    fVar370 = fVar207 * auVar13._0_4_ * 3.0;
    fVar372 = fVar224 * auVar13._4_4_ * 3.0;
    auVar29._4_4_ = fVar372;
    auVar29._0_4_ = fVar370;
    fVar373 = fVar233 * auVar13._8_4_ * 3.0;
    auVar29._8_4_ = fVar373;
    fVar374 = fVar262 * auVar13._12_4_ * 3.0;
    auVar29._12_4_ = fVar374;
    fVar375 = fVar207 * auVar13._16_4_ * 3.0;
    auVar29._16_4_ = fVar375;
    fVar376 = fVar224 * auVar13._20_4_ * 3.0;
    auVar29._20_4_ = fVar376;
    fVar377 = fVar233 * auVar13._24_4_ * 3.0;
    auVar29._24_4_ = fVar377;
    auVar29._28_4_ = fVar378;
    fVar208 = fVar207 * auVar14._0_4_ * 3.0;
    fVar231 = fVar224 * auVar14._4_4_ * 3.0;
    auVar30._4_4_ = fVar231;
    auVar30._0_4_ = fVar208;
    fVar252 = fVar233 * auVar14._8_4_ * 3.0;
    auVar30._8_4_ = fVar252;
    fVar228 = fVar262 * auVar14._12_4_ * 3.0;
    auVar30._12_4_ = fVar228;
    fVar207 = fVar207 * auVar14._16_4_ * 3.0;
    auVar30._16_4_ = fVar207;
    fVar224 = fVar224 * auVar14._20_4_ * 3.0;
    auVar30._20_4_ = fVar224;
    fVar233 = fVar233 * auVar14._24_4_ * 3.0;
    auVar30._24_4_ = fVar233;
    auVar30._28_4_ = fVar262;
    auVar101 = vperm2f128_avx(auVar394,auVar394,1);
    auVar101 = vshufps_avx(auVar101,auVar394,0x30);
    local_aa0 = vshufps_avx(auVar394,auVar101,0x29);
    auVar101 = vperm2f128_avx(auVar399,auVar399,1);
    auVar101 = vshufps_avx(auVar101,auVar399,0x30);
    _local_a00 = vshufps_avx(auVar399,auVar101,0x29);
    auVar155 = vsubps_avx(auVar327,auVar30);
    auVar101 = vperm2f128_avx(auVar155,auVar155,1);
    auVar101 = vshufps_avx(auVar101,auVar155,0x30);
    auVar14 = vshufps_avx(auVar155,auVar101,0x29);
    auVar15 = vsubps_avx(local_aa0,auVar394);
    auVar13 = vsubps_avx(_local_a00,auVar399);
    fVar203 = auVar15._0_4_;
    fVar225 = auVar15._4_4_;
    auVar31._4_4_ = fVar372 * fVar225;
    auVar31._0_4_ = fVar370 * fVar203;
    fVar254 = auVar15._8_4_;
    auVar31._8_4_ = fVar373 * fVar254;
    fVar232 = auVar15._12_4_;
    auVar31._12_4_ = fVar374 * fVar232;
    fVar263 = auVar15._16_4_;
    auVar31._16_4_ = fVar375 * fVar263;
    fVar297 = auVar15._20_4_;
    auVar31._20_4_ = fVar376 * fVar297;
    fVar392 = auVar15._24_4_;
    auVar31._24_4_ = fVar377 * fVar392;
    auVar31._28_4_ = auVar155._28_4_;
    fVar357 = auVar13._0_4_;
    fVar363 = auVar13._4_4_;
    auVar32._4_4_ = fVar363 * fVar311;
    auVar32._0_4_ = fVar357 * fVar300;
    fVar364 = auVar13._8_4_;
    auVar32._8_4_ = fVar364 * fVar312;
    fVar365 = auVar13._12_4_;
    auVar32._12_4_ = fVar365 * fVar314;
    fVar366 = auVar13._16_4_;
    auVar32._16_4_ = fVar366 * fVar316;
    fVar367 = auVar13._20_4_;
    auVar32._20_4_ = fVar367 * fVar318;
    fVar368 = auVar13._24_4_;
    auVar32._24_4_ = fVar368 * fVar320;
    auVar32._28_4_ = auVar101._28_4_;
    auVar13 = vsubps_avx(auVar32,auVar31);
    auVar101 = vperm2f128_avx(auVar382,auVar382,1);
    auVar101 = vshufps_avx(auVar101,auVar382,0x30);
    auVar340 = vshufps_avx(auVar382,auVar101,0x29);
    auVar16 = vsubps_avx(auVar340,auVar382);
    auVar33._4_4_ = fVar363 * fVar283;
    auVar33._0_4_ = fVar357 * fVar265;
    auVar33._8_4_ = fVar364 * fVar286;
    auVar33._12_4_ = fVar365 * fVar289;
    auVar33._16_4_ = fVar366 * fVar292;
    auVar33._20_4_ = fVar367 * fVar295;
    auVar33._24_4_ = fVar368 * fVar298;
    auVar33._28_4_ = auVar340._28_4_;
    fVar204 = auVar16._0_4_;
    fVar226 = auVar16._4_4_;
    auVar34._4_4_ = fVar372 * fVar226;
    auVar34._0_4_ = fVar370 * fVar204;
    fVar256 = auVar16._8_4_;
    auVar34._8_4_ = fVar373 * fVar256;
    fVar234 = auVar16._12_4_;
    auVar34._12_4_ = fVar374 * fVar234;
    fVar264 = auVar16._16_4_;
    auVar34._16_4_ = fVar375 * fVar264;
    fVar322 = auVar16._20_4_;
    auVar34._20_4_ = fVar376 * fVar322;
    fVar18 = auVar16._24_4_;
    auVar34._24_4_ = fVar377 * fVar18;
    auVar34._28_4_ = local_a00._28_4_;
    auVar167 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ = fVar226 * fVar311;
    auVar35._0_4_ = fVar204 * fVar300;
    auVar35._8_4_ = fVar256 * fVar312;
    auVar35._12_4_ = fVar234 * fVar314;
    auVar35._16_4_ = fVar264 * fVar316;
    auVar35._20_4_ = fVar322 * fVar318;
    auVar35._24_4_ = fVar18 * fVar320;
    auVar35._28_4_ = local_a00._28_4_;
    auVar36._4_4_ = fVar283 * fVar225;
    auVar36._0_4_ = fVar265 * fVar203;
    auVar36._8_4_ = fVar286 * fVar254;
    auVar36._12_4_ = fVar289 * fVar232;
    auVar36._16_4_ = fVar292 * fVar263;
    auVar36._20_4_ = fVar295 * fVar297;
    auVar36._24_4_ = fVar298 * fVar392;
    auVar36._28_4_ = auVar352._28_4_;
    auVar328 = vsubps_avx(auVar36,auVar35);
    fVar202 = auVar328._28_4_;
    auVar166._0_4_ = fVar204 * fVar204 + fVar203 * fVar203 + fVar357 * fVar357;
    auVar166._4_4_ = fVar226 * fVar226 + fVar225 * fVar225 + fVar363 * fVar363;
    auVar166._8_4_ = fVar256 * fVar256 + fVar254 * fVar254 + fVar364 * fVar364;
    auVar166._12_4_ = fVar234 * fVar234 + fVar232 * fVar232 + fVar365 * fVar365;
    auVar166._16_4_ = fVar264 * fVar264 + fVar263 * fVar263 + fVar366 * fVar366;
    auVar166._20_4_ = fVar322 * fVar322 + fVar297 * fVar297 + fVar367 * fVar367;
    auVar166._24_4_ = fVar18 * fVar18 + fVar392 * fVar392 + fVar368 * fVar368;
    auVar166._28_4_ = fVar202 + fVar202 + auVar13._28_4_;
    auVar101 = vrcpps_avx(auVar166);
    fVar230 = auVar101._0_4_;
    fVar257 = auVar101._4_4_;
    auVar37._4_4_ = fVar257 * auVar166._4_4_;
    auVar37._0_4_ = fVar230 * auVar166._0_4_;
    fVar259 = auVar101._8_4_;
    auVar37._8_4_ = fVar259 * auVar166._8_4_;
    fVar261 = auVar101._12_4_;
    auVar37._12_4_ = fVar261 * auVar166._12_4_;
    fVar288 = auVar101._16_4_;
    auVar37._16_4_ = fVar288 * auVar166._16_4_;
    fVar291 = auVar101._20_4_;
    auVar37._20_4_ = fVar291 * auVar166._20_4_;
    fVar294 = auVar101._24_4_;
    auVar37._24_4_ = fVar294 * auVar166._24_4_;
    auVar37._28_4_ = auVar352._28_4_;
    auVar383._8_4_ = 0x3f800000;
    auVar383._0_8_ = 0x3f8000003f800000;
    auVar383._12_4_ = 0x3f800000;
    auVar383._16_4_ = 0x3f800000;
    auVar383._20_4_ = 0x3f800000;
    auVar383._24_4_ = 0x3f800000;
    auVar383._28_4_ = 0x3f800000;
    auVar25 = vsubps_avx(auVar383,auVar37);
    fVar230 = auVar25._0_4_ * fVar230 + fVar230;
    fVar257 = auVar25._4_4_ * fVar257 + fVar257;
    fVar259 = auVar25._8_4_ * fVar259 + fVar259;
    fVar261 = auVar25._12_4_ * fVar261 + fVar261;
    fVar288 = auVar25._16_4_ * fVar288 + fVar288;
    fVar291 = auVar25._20_4_ * fVar291 + fVar291;
    fVar294 = auVar25._24_4_ * fVar294 + fVar294;
    auVar155 = vperm2f128_avx(auVar28,auVar28,1);
    auVar155 = vshufps_avx(auVar155,auVar28,0x30);
    local_9a0 = vshufps_avx(auVar28,auVar155,0x29);
    auVar155 = vperm2f128_avx(auVar29,auVar29,1);
    auVar155 = vshufps_avx(auVar155,auVar29,0x30);
    local_9c0 = vshufps_avx(auVar29,auVar155,0x29);
    fVar379 = local_9c0._0_4_;
    fVar386 = local_9c0._4_4_;
    auVar38._4_4_ = fVar386 * fVar225;
    auVar38._0_4_ = fVar379 * fVar203;
    fVar387 = local_9c0._8_4_;
    auVar38._8_4_ = fVar387 * fVar254;
    fVar388 = local_9c0._12_4_;
    auVar38._12_4_ = fVar388 * fVar232;
    fVar389 = local_9c0._16_4_;
    auVar38._16_4_ = fVar389 * fVar263;
    fVar390 = local_9c0._20_4_;
    auVar38._20_4_ = fVar390 * fVar297;
    fVar391 = local_9c0._24_4_;
    auVar38._24_4_ = fVar391 * fVar392;
    auVar38._28_4_ = auVar155._28_4_;
    fVar205 = local_9a0._0_4_;
    fVar227 = local_9a0._4_4_;
    auVar39._4_4_ = fVar363 * fVar227;
    auVar39._0_4_ = fVar357 * fVar205;
    fVar258 = local_9a0._8_4_;
    auVar39._8_4_ = fVar364 * fVar258;
    fVar253 = local_9a0._12_4_;
    auVar39._12_4_ = fVar365 * fVar253;
    fVar282 = local_9a0._16_4_;
    auVar39._16_4_ = fVar366 * fVar282;
    fVar332 = local_9a0._20_4_;
    auVar39._20_4_ = fVar367 * fVar332;
    fVar19 = local_9a0._24_4_;
    auVar39._24_4_ = fVar368 * fVar19;
    auVar39._28_4_ = fVar378;
    auVar26 = vsubps_avx(auVar39,auVar38);
    auVar155 = vperm2f128_avx(auVar27,auVar27,1);
    auVar155 = vshufps_avx(auVar155,auVar27,0x30);
    local_780 = vshufps_avx(auVar27,auVar155,0x29);
    fVar206 = local_780._0_4_;
    fVar229 = local_780._4_4_;
    auVar40._4_4_ = fVar363 * fVar229;
    auVar40._0_4_ = fVar357 * fVar206;
    fVar260 = local_780._8_4_;
    auVar40._8_4_ = fVar364 * fVar260;
    fVar255 = local_780._12_4_;
    auVar40._12_4_ = fVar365 * fVar255;
    fVar285 = local_780._16_4_;
    auVar40._16_4_ = fVar366 * fVar285;
    fVar333 = local_780._20_4_;
    auVar40._20_4_ = fVar367 * fVar333;
    fVar20 = local_780._24_4_;
    auVar40._24_4_ = fVar368 * fVar20;
    auVar40._28_4_ = auVar155._28_4_;
    auVar41._4_4_ = fVar386 * fVar226;
    auVar41._0_4_ = fVar379 * fVar204;
    auVar41._8_4_ = fVar387 * fVar256;
    auVar41._12_4_ = fVar388 * fVar234;
    auVar41._16_4_ = fVar389 * fVar264;
    auVar41._20_4_ = fVar390 * fVar322;
    uVar84 = local_9c0._28_4_;
    auVar41._24_4_ = fVar391 * fVar18;
    auVar41._28_4_ = uVar84;
    auVar155 = vsubps_avx(auVar41,auVar40);
    auVar42._4_4_ = fVar226 * fVar227;
    auVar42._0_4_ = fVar204 * fVar205;
    auVar42._8_4_ = fVar256 * fVar258;
    auVar42._12_4_ = fVar234 * fVar253;
    auVar42._16_4_ = fVar264 * fVar282;
    auVar42._20_4_ = fVar322 * fVar332;
    auVar42._24_4_ = fVar18 * fVar19;
    auVar42._28_4_ = uVar84;
    auVar43._4_4_ = fVar229 * fVar225;
    auVar43._0_4_ = fVar206 * fVar203;
    auVar43._8_4_ = fVar260 * fVar254;
    auVar43._12_4_ = fVar255 * fVar232;
    auVar43._16_4_ = fVar285 * fVar263;
    auVar43._20_4_ = fVar333 * fVar297;
    auVar43._24_4_ = fVar20 * fVar392;
    auVar43._28_4_ = auVar394._28_4_;
    auVar102 = vsubps_avx(auVar43,auVar42);
    auVar44._4_4_ =
         (auVar13._4_4_ * auVar13._4_4_ +
         auVar167._4_4_ * auVar167._4_4_ + auVar328._4_4_ * auVar328._4_4_) * fVar257;
    auVar44._0_4_ =
         (auVar13._0_4_ * auVar13._0_4_ +
         auVar167._0_4_ * auVar167._0_4_ + auVar328._0_4_ * auVar328._0_4_) * fVar230;
    auVar44._8_4_ =
         (auVar13._8_4_ * auVar13._8_4_ +
         auVar167._8_4_ * auVar167._8_4_ + auVar328._8_4_ * auVar328._8_4_) * fVar259;
    auVar44._12_4_ =
         (auVar13._12_4_ * auVar13._12_4_ +
         auVar167._12_4_ * auVar167._12_4_ + auVar328._12_4_ * auVar328._12_4_) * fVar261;
    auVar44._16_4_ =
         (auVar13._16_4_ * auVar13._16_4_ +
         auVar167._16_4_ * auVar167._16_4_ + auVar328._16_4_ * auVar328._16_4_) * fVar288;
    auVar44._20_4_ =
         (auVar13._20_4_ * auVar13._20_4_ +
         auVar167._20_4_ * auVar167._20_4_ + auVar328._20_4_ * auVar328._20_4_) * fVar291;
    auVar44._24_4_ =
         (auVar13._24_4_ * auVar13._24_4_ +
         auVar167._24_4_ * auVar167._24_4_ + auVar328._24_4_ * auVar328._24_4_) * fVar294;
    auVar44._28_4_ = auVar13._28_4_ + auVar167._28_4_ + fVar202;
    auVar45._4_4_ =
         (auVar26._4_4_ * auVar26._4_4_ +
         auVar155._4_4_ * auVar155._4_4_ + auVar102._4_4_ * auVar102._4_4_) * fVar257;
    auVar45._0_4_ =
         (auVar26._0_4_ * auVar26._0_4_ +
         auVar155._0_4_ * auVar155._0_4_ + auVar102._0_4_ * auVar102._0_4_) * fVar230;
    auVar45._8_4_ =
         (auVar26._8_4_ * auVar26._8_4_ +
         auVar155._8_4_ * auVar155._8_4_ + auVar102._8_4_ * auVar102._8_4_) * fVar259;
    auVar45._12_4_ =
         (auVar26._12_4_ * auVar26._12_4_ +
         auVar155._12_4_ * auVar155._12_4_ + auVar102._12_4_ * auVar102._12_4_) * fVar261;
    auVar45._16_4_ =
         (auVar26._16_4_ * auVar26._16_4_ +
         auVar155._16_4_ * auVar155._16_4_ + auVar102._16_4_ * auVar102._16_4_) * fVar288;
    auVar45._20_4_ =
         (auVar26._20_4_ * auVar26._20_4_ +
         auVar155._20_4_ * auVar155._20_4_ + auVar102._20_4_ * auVar102._20_4_) * fVar291;
    auVar45._24_4_ =
         (auVar26._24_4_ * auVar26._24_4_ +
         auVar155._24_4_ * auVar155._24_4_ + auVar102._24_4_ * auVar102._24_4_) * fVar294;
    auVar45._28_4_ = auVar25._28_4_ + auVar101._28_4_;
    auVar101 = vmaxps_avx(auVar44,auVar45);
    auVar155 = vperm2f128_avx(auVar327,auVar327,1);
    auVar155 = vshufps_avx(auVar155,auVar327,0x30);
    auVar167 = vshufps_avx(auVar327,auVar155,0x29);
    auVar106._0_4_ = auVar327._0_4_ + fVar208;
    auVar106._4_4_ = auVar327._4_4_ + fVar231;
    auVar106._8_4_ = auVar327._8_4_ + fVar252;
    auVar106._12_4_ = auVar327._12_4_ + fVar228;
    auVar106._16_4_ = auVar327._16_4_ + fVar207;
    auVar106._20_4_ = auVar327._20_4_ + fVar224;
    auVar106._24_4_ = auVar327._24_4_ + fVar233;
    auVar106._28_4_ = auVar327._28_4_ + fVar262;
    auVar155 = vmaxps_avx(auVar327,auVar106);
    auVar13 = vmaxps_avx(auVar14,auVar167);
    auVar155 = vmaxps_avx(auVar155,auVar13);
    auVar13 = vrsqrtps_avx(auVar166);
    fVar202 = auVar13._0_4_;
    fVar207 = auVar13._4_4_;
    fVar208 = auVar13._8_4_;
    fVar224 = auVar13._12_4_;
    fVar231 = auVar13._16_4_;
    fVar233 = auVar13._20_4_;
    fVar252 = auVar13._24_4_;
    local_4c0 = fVar202 * 1.5 + fVar202 * fVar202 * fVar202 * auVar166._0_4_ * -0.5;
    fStack_4bc = fVar207 * 1.5 + fVar207 * fVar207 * fVar207 * auVar166._4_4_ * -0.5;
    fStack_4b8 = fVar208 * 1.5 + fVar208 * fVar208 * fVar208 * auVar166._8_4_ * -0.5;
    fStack_4b4 = fVar224 * 1.5 + fVar224 * fVar224 * fVar224 * auVar166._12_4_ * -0.5;
    fStack_4b0 = fVar231 * 1.5 + fVar231 * fVar231 * fVar231 * auVar166._16_4_ * -0.5;
    fStack_4ac = fVar233 * 1.5 + fVar233 * fVar233 * fVar233 * auVar166._20_4_ * -0.5;
    fStack_4a8 = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar166._24_4_ * -0.5;
    auVar328 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar25 = vsubps_avx(auVar328,auVar394);
    auVar26 = vsubps_avx(auVar328,auVar399);
    fVar207 = auVar26._0_4_;
    fVar231 = auVar26._4_4_;
    fVar262 = auVar26._8_4_;
    fVar257 = auVar26._12_4_;
    fVar288 = auVar26._16_4_;
    fVar334 = auVar26._20_4_;
    fVar21 = auVar26._24_4_;
    fVar208 = auVar25._0_4_;
    fVar233 = auVar25._4_4_;
    fVar228 = auVar25._8_4_;
    fVar259 = auVar25._12_4_;
    fVar291 = auVar25._16_4_;
    fVar369 = auVar25._20_4_;
    fVar22 = auVar25._24_4_;
    auVar143 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar103 = vsubps_avx(auVar143,auVar382);
    fVar224 = auVar103._0_4_;
    fVar252 = auVar103._4_4_;
    fVar230 = auVar103._8_4_;
    fVar261 = auVar103._12_4_;
    fVar294 = auVar103._16_4_;
    fVar378 = auVar103._20_4_;
    fVar23 = auVar103._24_4_;
    auVar384._0_4_ =
         (float)local_800._0_4_ * fVar224 +
         (float)local_820._0_4_ * fVar208 + (float)local_7e0._0_4_ * fVar207;
    auVar384._4_4_ =
         (float)local_800._4_4_ * fVar252 +
         (float)local_820._4_4_ * fVar233 + (float)local_7e0._4_4_ * fVar231;
    auVar384._8_4_ = fStack_7f8 * fVar230 + fStack_818 * fVar228 + fStack_7d8 * fVar262;
    auVar384._12_4_ = fStack_7f4 * fVar261 + fStack_814 * fVar259 + fStack_7d4 * fVar257;
    auVar384._16_4_ = fStack_7f0 * fVar294 + fStack_810 * fVar291 + fStack_7d0 * fVar288;
    auVar384._20_4_ = fStack_7ec * fVar378 + fStack_80c * fVar369 + fStack_7cc * fVar334;
    auVar384._24_4_ = fStack_7e8 * fVar23 + fStack_808 * fVar22 + fStack_7c8 * fVar21;
    auVar384._28_4_ = auVar394._28_4_ + auVar102._28_4_ + 1.5;
    auVar395._0_4_ = fVar224 * fVar224 + fVar208 * fVar208 + fVar207 * fVar207;
    auVar395._4_4_ = fVar252 * fVar252 + fVar233 * fVar233 + fVar231 * fVar231;
    auVar395._8_4_ = fVar230 * fVar230 + fVar228 * fVar228 + fVar262 * fVar262;
    auVar395._12_4_ = fVar261 * fVar261 + fVar259 * fVar259 + fVar257 * fVar257;
    auVar395._16_4_ = fVar294 * fVar294 + fVar291 * fVar291 + fVar288 * fVar288;
    auVar395._20_4_ = fVar378 * fVar378 + fVar369 * fVar369 + fVar334 * fVar334;
    auVar395._24_4_ = fVar23 * fVar23 + fVar22 * fVar22 + fVar21 * fVar21;
    auVar395._28_4_ = auVar399._28_4_ + auVar399._28_4_ + auVar394._28_4_;
    fVar335 = (float)local_800._0_4_ * fVar204 * local_4c0 +
              local_4c0 * fVar203 * (float)local_820._0_4_ +
              fVar357 * local_4c0 * (float)local_7e0._0_4_;
    fVar341 = (float)local_800._4_4_ * fVar226 * fStack_4bc +
              fStack_4bc * fVar225 * (float)local_820._4_4_ +
              fVar363 * fStack_4bc * (float)local_7e0._4_4_;
    fVar342 = fStack_7f8 * fVar256 * fStack_4b8 +
              fStack_4b8 * fVar254 * fStack_818 + fVar364 * fStack_4b8 * fStack_7d8;
    fVar343 = fStack_7f4 * fVar234 * fStack_4b4 +
              fStack_4b4 * fVar232 * fStack_814 + fVar365 * fStack_4b4 * fStack_7d4;
    fVar344 = fStack_7f0 * fVar264 * fStack_4b0 +
              fStack_4b0 * fVar263 * fStack_810 + fVar366 * fStack_4b0 * fStack_7d0;
    fVar346 = fStack_7ec * fVar322 * fStack_4ac +
              fStack_4ac * fVar297 * fStack_80c + fVar367 * fStack_4ac * fStack_7cc;
    fVar348 = fStack_7e8 * fVar18 * fStack_4a8 +
              fStack_4a8 * fVar392 * fStack_808 + fVar368 * fStack_4a8 * fStack_7c8;
    fVar202 = fStack_7e4 + fStack_804 + fStack_7c4;
    local_9e0 = fVar224 * fVar204 * local_4c0 +
                local_4c0 * fVar203 * fVar208 + fVar357 * local_4c0 * fVar207;
    fStack_9dc = fVar252 * fVar226 * fStack_4bc +
                 fStack_4bc * fVar225 * fVar233 + fVar363 * fStack_4bc * fVar231;
    fStack_9d8 = fVar230 * fVar256 * fStack_4b8 +
                 fStack_4b8 * fVar254 * fVar228 + fVar364 * fStack_4b8 * fVar262;
    fStack_9d4 = fVar261 * fVar234 * fStack_4b4 +
                 fStack_4b4 * fVar232 * fVar259 + fVar365 * fStack_4b4 * fVar257;
    fStack_9d0 = fVar294 * fVar264 * fStack_4b0 +
                 fStack_4b0 * fVar263 * fVar291 + fVar366 * fStack_4b0 * fVar288;
    fStack_9cc = fVar378 * fVar322 * fStack_4ac +
                 fStack_4ac * fVar297 * fVar369 + fVar367 * fStack_4ac * fVar334;
    fStack_9c8 = fVar23 * fVar18 * fStack_4a8 +
                 fStack_4a8 * fVar392 * fVar22 + fVar368 * fStack_4a8 * fVar21;
    fStack_9c4 = fStack_804 + fVar202;
    auVar46._4_4_ = fVar341 * fStack_9dc;
    auVar46._0_4_ = fVar335 * local_9e0;
    auVar46._8_4_ = fVar342 * fStack_9d8;
    auVar46._12_4_ = fVar343 * fStack_9d4;
    auVar46._16_4_ = fVar344 * fStack_9d0;
    auVar46._20_4_ = fVar346 * fStack_9cc;
    auVar46._24_4_ = fVar348 * fStack_9c8;
    auVar46._28_4_ = fVar202;
    auVar102 = vsubps_avx(auVar384,auVar46);
    auVar47._4_4_ = fStack_9dc * fStack_9dc;
    auVar47._0_4_ = local_9e0 * local_9e0;
    auVar47._8_4_ = fStack_9d8 * fStack_9d8;
    auVar47._12_4_ = fStack_9d4 * fStack_9d4;
    auVar47._16_4_ = fStack_9d0 * fStack_9d0;
    auVar47._20_4_ = fStack_9cc * fStack_9cc;
    auVar47._24_4_ = fStack_9c8 * fStack_9c8;
    auVar47._28_4_ = fStack_804;
    local_920 = vsubps_avx(auVar395,auVar47);
    auVar328 = vsqrtps_avx(auVar101);
    fVar202 = (auVar328._0_4_ + auVar155._0_4_) * 1.0000002;
    fVar121 = (auVar328._4_4_ + auVar155._4_4_) * 1.0000002;
    fVar123 = (auVar328._8_4_ + auVar155._8_4_) * 1.0000002;
    fVar125 = (auVar328._12_4_ + auVar155._12_4_) * 1.0000002;
    fVar126 = (auVar328._16_4_ + auVar155._16_4_) * 1.0000002;
    fVar127 = (auVar328._20_4_ + auVar155._20_4_) * 1.0000002;
    fVar128 = (auVar328._24_4_ + auVar155._24_4_) * 1.0000002;
    auVar48._4_4_ = fVar121 * fVar121;
    auVar48._0_4_ = fVar202 * fVar202;
    auVar48._8_4_ = fVar123 * fVar123;
    auVar48._12_4_ = fVar125 * fVar125;
    auVar48._16_4_ = fVar126 * fVar126;
    auVar48._20_4_ = fVar127 * fVar127;
    auVar48._24_4_ = fVar128 * fVar128;
    auVar48._28_4_ = auVar328._28_4_ + auVar155._28_4_;
    fVar121 = auVar102._0_4_ + auVar102._0_4_;
    fVar123 = auVar102._4_4_ + auVar102._4_4_;
    local_940._0_8_ = CONCAT44(fVar123,fVar121);
    local_940._8_4_ = auVar102._8_4_ + auVar102._8_4_;
    local_940._12_4_ = auVar102._12_4_ + auVar102._12_4_;
    local_940._16_4_ = auVar102._16_4_ + auVar102._16_4_;
    local_940._20_4_ = auVar102._20_4_ + auVar102._20_4_;
    local_940._24_4_ = auVar102._24_4_ + auVar102._24_4_;
    fVar202 = auVar102._28_4_;
    local_940._28_4_ = fVar202 + fVar202;
    auVar155 = vsubps_avx(local_920,auVar48);
    local_380._4_4_ = fVar341 * fVar341;
    local_380._0_4_ = fVar335 * fVar335;
    local_380._8_4_ = fVar342 * fVar342;
    local_380._12_4_ = fVar343 * fVar343;
    local_380._16_4_ = fVar344 * fVar344;
    local_380._20_4_ = fVar346 * fVar346;
    local_380._24_4_ = fVar348 * fVar348;
    local_380._28_4_ = local_920._28_4_;
    local_4e0 = vsubps_avx(local_2a0,local_380);
    auVar49._4_4_ = fVar123 * fVar123;
    auVar49._0_4_ = fVar121 * fVar121;
    auVar49._8_4_ = local_940._8_4_ * local_940._8_4_;
    auVar49._12_4_ = local_940._12_4_ * local_940._12_4_;
    auVar49._16_4_ = local_940._16_4_ * local_940._16_4_;
    auVar49._20_4_ = local_940._20_4_ * local_940._20_4_;
    auVar49._24_4_ = local_940._24_4_ * local_940._24_4_;
    auVar49._28_4_ = fVar202;
    fVar125 = local_4e0._0_4_;
    fVar126 = local_4e0._4_4_;
    fVar127 = local_4e0._8_4_;
    fVar128 = local_4e0._12_4_;
    fVar345 = local_4e0._16_4_;
    fVar347 = local_4e0._20_4_;
    fVar349 = local_4e0._24_4_;
    auVar50._4_4_ = auVar155._4_4_ * fVar126 * 4.0;
    auVar50._0_4_ = auVar155._0_4_ * fVar125 * 4.0;
    auVar50._8_4_ = auVar155._8_4_ * fVar127 * 4.0;
    auVar50._12_4_ = auVar155._12_4_ * fVar128 * 4.0;
    auVar50._16_4_ = auVar155._16_4_ * fVar345 * 4.0;
    auVar50._20_4_ = auVar155._20_4_ * fVar347 * 4.0;
    auVar50._24_4_ = auVar155._24_4_ * fVar349 * 4.0;
    auVar50._28_4_ = 0x40800000;
    auVar102 = vsubps_avx(auVar49,auVar50);
    auVar101 = vcmpps_avx(auVar102,auVar143,5);
    fVar202 = local_4e0._28_4_;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      local_ca0._8_4_ = 0x7f800000;
      local_ca0._0_8_ = 0x7f8000007f800000;
      local_ca0._12_4_ = 0x7f800000;
      local_ca0._16_4_ = 0x7f800000;
      local_ca0._20_4_ = 0x7f800000;
      local_ca0._24_4_ = 0x7f800000;
      local_ca0._28_4_ = 0x7f800000;
      auVar396._8_4_ = 0xff800000;
      auVar396._0_8_ = 0xff800000ff800000;
      auVar396._12_4_ = 0xff800000;
      auVar396._16_4_ = 0xff800000;
      auVar396._20_4_ = 0xff800000;
      auVar396._24_4_ = 0xff800000;
      auVar396._28_4_ = 0xff800000;
    }
    else {
      auVar143 = vcmpps_avx(auVar102,auVar143,5);
      auVar144 = vsqrtps_avx(auVar102);
      auVar274._0_4_ = fVar125 + fVar125;
      auVar274._4_4_ = fVar126 + fVar126;
      auVar274._8_4_ = fVar127 + fVar127;
      auVar274._12_4_ = fVar128 + fVar128;
      auVar274._16_4_ = fVar345 + fVar345;
      auVar274._20_4_ = fVar347 + fVar347;
      auVar274._24_4_ = fVar349 + fVar349;
      auVar274._28_4_ = fVar202 + fVar202;
      auVar102 = vrcpps_avx(auVar274);
      fVar266 = auVar102._0_4_;
      fVar284 = auVar102._4_4_;
      auVar51._4_4_ = auVar274._4_4_ * fVar284;
      auVar51._0_4_ = auVar274._0_4_ * fVar266;
      fVar287 = auVar102._8_4_;
      auVar51._8_4_ = auVar274._8_4_ * fVar287;
      fVar290 = auVar102._12_4_;
      auVar51._12_4_ = auVar274._12_4_ * fVar290;
      fVar293 = auVar102._16_4_;
      auVar51._16_4_ = auVar274._16_4_ * fVar293;
      fVar296 = auVar102._20_4_;
      auVar51._20_4_ = auVar274._20_4_ * fVar296;
      fVar299 = auVar102._24_4_;
      auVar51._24_4_ = auVar274._24_4_ * fVar299;
      auVar51._28_4_ = auVar274._28_4_;
      auVar329._8_4_ = 0x3f800000;
      auVar329._0_8_ = 0x3f8000003f800000;
      auVar329._12_4_ = 0x3f800000;
      auVar329._16_4_ = 0x3f800000;
      auVar329._20_4_ = 0x3f800000;
      auVar329._24_4_ = 0x3f800000;
      auVar329._28_4_ = 0x3f800000;
      auVar145 = vsubps_avx(auVar329,auVar51);
      fVar266 = fVar266 + fVar266 * auVar145._0_4_;
      fVar284 = fVar284 + fVar284 * auVar145._4_4_;
      fVar287 = fVar287 + fVar287 * auVar145._8_4_;
      fVar290 = fVar290 + fVar290 * auVar145._12_4_;
      fVar293 = fVar293 + fVar293 * auVar145._16_4_;
      fVar296 = fVar296 + fVar296 * auVar145._20_4_;
      fVar299 = fVar299 + fVar299 * auVar145._24_4_;
      auVar308._0_8_ = CONCAT44(fVar123,fVar121) ^ 0x8000000080000000;
      auVar308._8_4_ = -local_940._8_4_;
      auVar308._12_4_ = -local_940._12_4_;
      auVar308._16_4_ = -local_940._16_4_;
      auVar308._20_4_ = -local_940._20_4_;
      auVar308._24_4_ = -local_940._24_4_;
      auVar308._28_4_ = -local_940._28_4_;
      auVar146 = vsubps_avx(auVar308,auVar144);
      fVar121 = auVar146._0_4_ * fVar266;
      fVar123 = auVar146._4_4_ * fVar284;
      auVar52._4_4_ = fVar123;
      auVar52._0_4_ = fVar121;
      fVar313 = auVar146._8_4_ * fVar287;
      auVar52._8_4_ = fVar313;
      fVar315 = auVar146._12_4_ * fVar290;
      auVar52._12_4_ = fVar315;
      fVar317 = auVar146._16_4_ * fVar293;
      auVar52._16_4_ = fVar317;
      fVar319 = auVar146._20_4_ * fVar296;
      auVar52._20_4_ = fVar319;
      fVar321 = auVar146._24_4_ * fVar299;
      auVar52._24_4_ = fVar321;
      auVar52._28_4_ = auVar146._28_4_;
      auVar144 = vsubps_avx(auVar144,local_940);
      fVar266 = auVar144._0_4_ * fVar266;
      fVar284 = auVar144._4_4_ * fVar284;
      auVar53._4_4_ = fVar284;
      auVar53._0_4_ = fVar266;
      fVar287 = auVar144._8_4_ * fVar287;
      auVar53._8_4_ = fVar287;
      fVar290 = auVar144._12_4_ * fVar290;
      auVar53._12_4_ = fVar290;
      fVar293 = auVar144._16_4_ * fVar293;
      auVar53._16_4_ = fVar293;
      fVar296 = auVar144._20_4_ * fVar296;
      auVar53._20_4_ = fVar296;
      fVar299 = auVar144._24_4_ * fVar299;
      auVar53._24_4_ = fVar299;
      auVar53._28_4_ = auVar144._28_4_;
      local_340 = local_4c0 * (local_9e0 + fVar335 * fVar121);
      fStack_33c = fStack_4bc * (fStack_9dc + fVar341 * fVar123);
      fStack_338 = fStack_4b8 * (fStack_9d8 + fVar342 * fVar313);
      fStack_334 = fStack_4b4 * (fStack_9d4 + fVar343 * fVar315);
      fStack_330 = fStack_4b0 * (fStack_9d0 + fVar344 * fVar317);
      fStack_32c = fStack_4ac * (fStack_9cc + fVar346 * fVar319);
      fStack_328 = fStack_4a8 * (fStack_9c8 + fVar348 * fVar321);
      fStack_324 = fStack_9c4 + auVar102._28_4_ + auVar145._28_4_;
      auVar275._8_4_ = 0x7fffffff;
      auVar275._0_8_ = 0x7fffffff7fffffff;
      auVar275._12_4_ = 0x7fffffff;
      auVar275._16_4_ = 0x7fffffff;
      auVar275._20_4_ = 0x7fffffff;
      auVar275._24_4_ = 0x7fffffff;
      auVar275._28_4_ = 0x7fffffff;
      auVar102 = vandps_avx(local_380,auVar275);
      auVar144 = vmaxps_avx(local_460,auVar102);
      auVar54._4_4_ = auVar144._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar144._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar144._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar144._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar144._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar144._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar144._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar144._28_4_;
      auVar102 = vandps_avx(local_4e0,auVar275);
      auVar102 = vcmpps_avx(auVar102,auVar54,1);
      auVar330._8_4_ = 0x7f800000;
      auVar330._0_8_ = 0x7f8000007f800000;
      auVar330._12_4_ = 0x7f800000;
      auVar330._16_4_ = 0x7f800000;
      auVar330._20_4_ = 0x7f800000;
      auVar330._24_4_ = 0x7f800000;
      auVar330._28_4_ = 0x7f800000;
      local_ca0 = vblendvps_avx(auVar330,auVar52,auVar143);
      local_360 = local_4c0 * (local_9e0 + fVar335 * fVar266);
      fStack_35c = fStack_4bc * (fStack_9dc + fVar341 * fVar284);
      fStack_358 = fStack_4b8 * (fStack_9d8 + fVar342 * fVar287);
      fStack_354 = fStack_4b4 * (fStack_9d4 + fVar343 * fVar290);
      fStack_350 = fStack_4b0 * (fStack_9d0 + fVar344 * fVar293);
      fStack_34c = fStack_4ac * (fStack_9cc + fVar346 * fVar296);
      fStack_348 = fStack_4a8 * (fStack_9c8 + fVar348 * fVar299);
      fStack_344 = fStack_9c4 + auVar144._28_4_;
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
      auVar396 = vblendvps_avx(auVar276,auVar53,auVar143);
      auVar144 = auVar143 & auVar102;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar101 = vandps_avx(auVar102,auVar143);
        auVar237 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar102 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,2);
        auVar385._8_4_ = 0xff800000;
        auVar385._0_8_ = 0xff800000ff800000;
        auVar385._12_4_ = 0xff800000;
        auVar385._16_4_ = 0xff800000;
        auVar385._20_4_ = 0xff800000;
        auVar385._24_4_ = 0xff800000;
        auVar385._28_4_ = 0xff800000;
        auVar400._8_4_ = 0x7f800000;
        auVar400._0_8_ = 0x7f8000007f800000;
        auVar400._12_4_ = 0x7f800000;
        auVar400._16_4_ = 0x7f800000;
        auVar400._20_4_ = 0x7f800000;
        auVar400._24_4_ = 0x7f800000;
        auVar400._28_4_ = 0x7f800000;
        auVar155 = vblendvps_avx(auVar400,auVar385,auVar102);
        auVar190 = vpmovsxwd_avx(auVar237);
        auVar237 = vpunpckhwd_avx(auVar237,auVar237);
        auVar251._16_16_ = auVar237;
        auVar251._0_16_ = auVar190;
        local_ca0 = vblendvps_avx(local_ca0,auVar155,auVar251);
        auVar155 = vblendvps_avx(auVar385,auVar400,auVar102);
        auVar396 = vblendvps_avx(auVar396,auVar155,auVar251);
        auVar155 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar117._0_4_ = auVar101._0_4_ ^ auVar155._0_4_;
        auVar117._4_4_ = auVar101._4_4_ ^ auVar155._4_4_;
        auVar117._8_4_ = auVar101._8_4_ ^ auVar155._8_4_;
        auVar117._12_4_ = auVar101._12_4_ ^ auVar155._12_4_;
        auVar117._16_4_ = auVar101._16_4_ ^ auVar155._16_4_;
        auVar117._20_4_ = auVar101._20_4_ ^ auVar155._20_4_;
        auVar117._24_4_ = auVar101._24_4_ ^ auVar155._24_4_;
        auVar117._28_4_ = auVar101._28_4_ ^ auVar155._28_4_;
        auVar101 = vorps_avx(auVar102,auVar117);
        auVar101 = vandps_avx(auVar143,auVar101);
      }
    }
    auVar155 = local_420 & auVar101;
    auVar281 = ZEXT3264(local_a80);
    auVar402 = ZEXT3264(local_840);
    if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar155 >> 0x7f,0) == '\0') &&
          (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar155 >> 0xbf,0) == '\0') &&
        (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar155[0x1f])
    {
      auVar362 = ZEXT3264(local_a60);
    }
    else {
      fStack_4a4 = auVar13._28_4_ + auVar166._28_4_;
      local_620 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar237 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8c0._0_4_));
      auVar237 = vshufps_avx(auVar237,auVar237,0);
      auVar246._16_16_ = auVar237;
      auVar246._0_16_ = auVar237;
      auVar102 = vminps_avx(auVar246,auVar396);
      fVar296 = auVar26._28_4_;
      auVar148._0_4_ =
           (float)local_800._0_4_ * fVar265 +
           (float)local_820._0_4_ * fVar300 + (float)local_7e0._0_4_ * fVar370;
      auVar148._4_4_ =
           (float)local_800._4_4_ * fVar283 +
           (float)local_820._4_4_ * fVar311 + (float)local_7e0._4_4_ * fVar372;
      auVar148._8_4_ = fStack_7f8 * fVar286 + fStack_818 * fVar312 + fStack_7d8 * fVar373;
      auVar148._12_4_ = fStack_7f4 * fVar289 + fStack_814 * fVar314 + fStack_7d4 * fVar374;
      auVar148._16_4_ = fStack_7f0 * fVar292 + fStack_810 * fVar316 + fStack_7d0 * fVar375;
      auVar148._20_4_ = fStack_7ec * fVar295 + fStack_80c * fVar318 + fStack_7cc * fVar376;
      auVar148._24_4_ = fStack_7e8 * fVar298 + fStack_808 * fVar320 + fStack_7c8 * fVar377;
      auVar148._28_4_ = fVar296 + auVar307._28_4_ + fVar296;
      auVar155 = vrcpps_avx(auVar148);
      fVar121 = auVar155._0_4_;
      fVar123 = auVar155._4_4_;
      auVar55._4_4_ = auVar148._4_4_ * fVar123;
      auVar55._0_4_ = auVar148._0_4_ * fVar121;
      fVar266 = auVar155._8_4_;
      auVar55._8_4_ = auVar148._8_4_ * fVar266;
      fVar284 = auVar155._12_4_;
      auVar55._12_4_ = auVar148._12_4_ * fVar284;
      fVar287 = auVar155._16_4_;
      auVar55._16_4_ = auVar148._16_4_ * fVar287;
      fVar290 = auVar155._20_4_;
      auVar55._20_4_ = auVar148._20_4_ * fVar290;
      fVar293 = auVar155._24_4_;
      auVar55._24_4_ = auVar148._24_4_ * fVar293;
      auVar55._28_4_ = auVar103._28_4_;
      auVar353._8_4_ = 0x3f800000;
      auVar353._0_8_ = 0x3f8000003f800000;
      auVar353._12_4_ = 0x3f800000;
      auVar353._16_4_ = 0x3f800000;
      auVar353._20_4_ = 0x3f800000;
      auVar353._24_4_ = 0x3f800000;
      auVar353._28_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar353,auVar55);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar155 = vandps_avx(auVar148,auVar309);
      auVar339._8_4_ = 0x219392ef;
      auVar339._0_8_ = 0x219392ef219392ef;
      auVar339._12_4_ = 0x219392ef;
      auVar339._16_4_ = 0x219392ef;
      auVar339._20_4_ = 0x219392ef;
      auVar339._24_4_ = 0x219392ef;
      auVar339._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar155,auVar339,1);
      auVar56._4_4_ =
           (fVar123 + fVar123 * auVar26._4_4_) *
           -(fVar252 * fVar283 + fVar233 * fVar311 + fVar231 * fVar372);
      auVar56._0_4_ =
           (fVar121 + fVar121 * auVar26._0_4_) *
           -(fVar224 * fVar265 + fVar208 * fVar300 + fVar207 * fVar370);
      auVar56._8_4_ =
           (fVar266 + fVar266 * auVar26._8_4_) *
           -(fVar230 * fVar286 + fVar228 * fVar312 + fVar262 * fVar373);
      auVar56._12_4_ =
           (fVar284 + fVar284 * auVar26._12_4_) *
           -(fVar261 * fVar289 + fVar259 * fVar314 + fVar257 * fVar374);
      auVar56._16_4_ =
           (fVar287 + fVar287 * auVar26._16_4_) *
           -(fVar294 * fVar292 + fVar291 * fVar316 + fVar288 * fVar375);
      auVar56._20_4_ =
           (fVar290 + fVar290 * auVar26._20_4_) *
           -(fVar378 * fVar295 + fVar369 * fVar318 + fVar334 * fVar376);
      auVar56._24_4_ =
           (fVar293 + fVar293 * auVar26._24_4_) *
           -(fVar23 * fVar298 + fVar22 * fVar320 + fVar21 * fVar377);
      auVar56._28_4_ = -(fVar296 + auVar25._28_4_ + fVar296);
      auVar78 = ZEXT812(0);
      auVar155 = vcmpps_avx(auVar148,ZEXT1232(auVar78) << 0x20,1);
      auVar155 = vorps_avx(auVar13,auVar155);
      auVar331._8_4_ = 0xff800000;
      auVar331._0_8_ = 0xff800000ff800000;
      auVar331._12_4_ = 0xff800000;
      auVar331._16_4_ = 0xff800000;
      auVar331._20_4_ = 0xff800000;
      auVar331._24_4_ = 0xff800000;
      auVar331._28_4_ = 0xff800000;
      auVar155 = vblendvps_avx(auVar56,auVar331,auVar155);
      auVar25 = vcmpps_avx(auVar148,ZEXT1232(auVar78) << 0x20,6);
      auVar13 = vorps_avx(auVar13,auVar25);
      auVar361._8_4_ = 0x7f800000;
      auVar361._0_8_ = 0x7f8000007f800000;
      auVar361._12_4_ = 0x7f800000;
      auVar361._16_4_ = 0x7f800000;
      auVar361._20_4_ = 0x7f800000;
      auVar361._24_4_ = 0x7f800000;
      auVar361._28_4_ = 0x7f800000;
      auVar13 = vblendvps_avx(auVar56,auVar361,auVar13);
      auVar25 = vmaxps_avx(local_300,local_ca0);
      auVar25 = vmaxps_avx(auVar25,auVar155);
      auVar26 = vminps_avx(auVar102,auVar13);
      auVar143 = ZEXT1232(auVar78) << 0x20;
      auVar155 = vsubps_avx(auVar143,local_aa0);
      auVar13 = vsubps_avx(auVar143,_local_a00);
      auVar57._4_4_ = auVar13._4_4_ * -fVar386;
      auVar57._0_4_ = auVar13._0_4_ * -fVar379;
      auVar57._8_4_ = auVar13._8_4_ * -fVar387;
      auVar57._12_4_ = auVar13._12_4_ * -fVar388;
      auVar57._16_4_ = auVar13._16_4_ * -fVar389;
      auVar57._20_4_ = auVar13._20_4_ * -fVar390;
      auVar57._24_4_ = auVar13._24_4_ * -fVar391;
      auVar57._28_4_ = auVar13._28_4_;
      auVar58._4_4_ = fVar227 * auVar155._4_4_;
      auVar58._0_4_ = fVar205 * auVar155._0_4_;
      auVar58._8_4_ = fVar258 * auVar155._8_4_;
      auVar58._12_4_ = fVar253 * auVar155._12_4_;
      auVar58._16_4_ = fVar282 * auVar155._16_4_;
      auVar58._20_4_ = fVar332 * auVar155._20_4_;
      auVar58._24_4_ = fVar19 * auVar155._24_4_;
      auVar58._28_4_ = auVar155._28_4_;
      auVar155 = vsubps_avx(auVar57,auVar58);
      auVar13 = vsubps_avx(auVar143,auVar340);
      auVar59._4_4_ = fVar229 * auVar13._4_4_;
      auVar59._0_4_ = fVar206 * auVar13._0_4_;
      auVar59._8_4_ = fVar260 * auVar13._8_4_;
      auVar59._12_4_ = fVar255 * auVar13._12_4_;
      auVar59._16_4_ = fVar285 * auVar13._16_4_;
      auVar59._20_4_ = fVar333 * auVar13._20_4_;
      uVar1 = auVar13._28_4_;
      auVar59._24_4_ = fVar20 * auVar13._24_4_;
      auVar59._28_4_ = uVar1;
      auVar340 = vsubps_avx(auVar155,auVar59);
      auVar60._4_4_ = (float)local_7e0._4_4_ * -fVar386;
      auVar60._0_4_ = (float)local_7e0._0_4_ * -fVar379;
      auVar60._8_4_ = fStack_7d8 * -fVar387;
      auVar60._12_4_ = fStack_7d4 * -fVar388;
      auVar60._16_4_ = fStack_7d0 * -fVar389;
      auVar60._20_4_ = fStack_7cc * -fVar390;
      auVar60._24_4_ = fStack_7c8 * -fVar391;
      auVar60._28_4_ = uVar84 ^ 0x80000000;
      auVar61._4_4_ = (float)local_820._4_4_ * fVar227;
      auVar61._0_4_ = (float)local_820._0_4_ * fVar205;
      auVar61._8_4_ = fStack_818 * fVar258;
      auVar61._12_4_ = fStack_814 * fVar253;
      auVar61._16_4_ = fStack_810 * fVar282;
      auVar61._20_4_ = fStack_80c * fVar332;
      auVar61._24_4_ = fStack_808 * fVar19;
      auVar61._28_4_ = uVar1;
      auVar155 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar229 * (float)local_800._4_4_;
      auVar62._0_4_ = fVar206 * (float)local_800._0_4_;
      auVar62._8_4_ = fVar260 * fStack_7f8;
      auVar62._12_4_ = fVar255 * fStack_7f4;
      auVar62._16_4_ = fVar285 * fStack_7f0;
      auVar62._20_4_ = fVar333 * fStack_7ec;
      auVar62._24_4_ = fVar20 * fStack_7e8;
      auVar62._28_4_ = uVar1;
      auVar354._8_4_ = 0x3f800000;
      auVar354._0_8_ = 0x3f8000003f800000;
      auVar354._12_4_ = 0x3f800000;
      auVar354._16_4_ = 0x3f800000;
      auVar354._20_4_ = 0x3f800000;
      auVar354._24_4_ = 0x3f800000;
      auVar354._28_4_ = 0x3f800000;
      auVar102 = vsubps_avx(auVar155,auVar62);
      auVar155 = vrcpps_avx(auVar102);
      fVar205 = auVar155._0_4_;
      fVar206 = auVar155._4_4_;
      auVar63._4_4_ = auVar102._4_4_ * fVar206;
      auVar63._0_4_ = auVar102._0_4_ * fVar205;
      fVar207 = auVar155._8_4_;
      auVar63._8_4_ = auVar102._8_4_ * fVar207;
      fVar208 = auVar155._12_4_;
      auVar63._12_4_ = auVar102._12_4_ * fVar208;
      fVar224 = auVar155._16_4_;
      auVar63._16_4_ = auVar102._16_4_ * fVar224;
      fVar227 = auVar155._20_4_;
      auVar63._20_4_ = auVar102._20_4_ * fVar227;
      fVar229 = auVar155._24_4_;
      auVar63._24_4_ = auVar102._24_4_ * fVar229;
      auVar63._28_4_ = fStack_7e4;
      auVar103 = vsubps_avx(auVar354,auVar63);
      auVar155 = vandps_avx(auVar102,auVar309);
      auVar310._8_4_ = 0x219392ef;
      auVar310._0_8_ = 0x219392ef219392ef;
      auVar310._12_4_ = 0x219392ef;
      auVar310._16_4_ = 0x219392ef;
      auVar310._20_4_ = 0x219392ef;
      auVar310._24_4_ = 0x219392ef;
      auVar310._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar155,auVar310,1);
      auVar64._4_4_ = (fVar206 + fVar206 * auVar103._4_4_) * -auVar340._4_4_;
      auVar64._0_4_ = (fVar205 + fVar205 * auVar103._0_4_) * -auVar340._0_4_;
      auVar64._8_4_ = (fVar207 + fVar207 * auVar103._8_4_) * -auVar340._8_4_;
      auVar64._12_4_ = (fVar208 + fVar208 * auVar103._12_4_) * -auVar340._12_4_;
      auVar64._16_4_ = (fVar224 + fVar224 * auVar103._16_4_) * -auVar340._16_4_;
      auVar64._20_4_ = (fVar227 + fVar227 * auVar103._20_4_) * -auVar340._20_4_;
      auVar64._24_4_ = (fVar229 + fVar229 * auVar103._24_4_) * -auVar340._24_4_;
      auVar64._28_4_ = auVar340._28_4_ ^ 0x80000000;
      auVar155 = vcmpps_avx(auVar102,auVar143,1);
      auVar155 = vorps_avx(auVar13,auVar155);
      auVar155 = vblendvps_avx(auVar64,auVar331,auVar155);
      _local_720 = vmaxps_avx(auVar25,auVar155);
      auVar340 = ZEXT1232(auVar78) << 0x20;
      auVar155 = vcmpps_avx(auVar102,auVar340,6);
      auVar155 = vorps_avx(auVar13,auVar155);
      auVar155 = vblendvps_avx(auVar64,auVar361,auVar155);
      auVar101 = vandps_avx(auVar101,local_420);
      local_3a0 = vminps_avx(auVar26,auVar155);
      auVar155 = vcmpps_avx(_local_720,local_3a0,2);
      auVar13 = auVar101 & auVar155;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar13 = vminps_avx(auVar327,auVar106);
        auVar14 = vminps_avx(auVar14,auVar167);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar13 = vsubps_avx(auVar13,auVar328);
        auVar101 = vandps_avx(auVar155,auVar101);
        auVar80._4_4_ = fStack_33c;
        auVar80._0_4_ = local_340;
        auVar80._8_4_ = fStack_338;
        auVar80._12_4_ = fStack_334;
        auVar80._16_4_ = fStack_330;
        auVar80._20_4_ = fStack_32c;
        auVar80._24_4_ = fStack_328;
        auVar80._28_4_ = fStack_324;
        auVar155 = vminps_avx(auVar80,auVar354);
        auVar155 = vmaxps_avx(auVar155,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar91 + fVar129 * (auVar155._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar120 + fVar156 * (auVar155._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar122 + fVar157 * (auVar155._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar124 + fVar158 * (auVar155._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar91 + fVar129 * (auVar155._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar120 + fVar156 * (auVar155._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar122 + fVar157 * (auVar155._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar124 + auVar155._28_4_ + 7.0;
        auVar79._4_4_ = fStack_35c;
        auVar79._0_4_ = local_360;
        auVar79._8_4_ = fStack_358;
        auVar79._12_4_ = fStack_354;
        auVar79._16_4_ = fStack_350;
        auVar79._20_4_ = fStack_34c;
        auVar79._24_4_ = fStack_348;
        auVar79._28_4_ = fStack_344;
        auVar155 = vminps_avx(auVar79,auVar354);
        auVar155 = vmaxps_avx(auVar155,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar91 + fVar129 * (auVar155._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar120 + fVar156 * (auVar155._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar122 + fVar157 * (auVar155._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar124 + fVar158 * (auVar155._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar91 + fVar129 * (auVar155._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar120 + fVar156 * (auVar155._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar122 + fVar157 * (auVar155._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar124 + auVar155._28_4_ + 7.0;
        auVar65._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar65._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar65._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar65._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar65._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar65._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar65._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar65._28_4_ = 0x3f7ffffc;
        auVar155 = vmaxps_avx(auVar340,auVar65);
        auVar66._4_4_ = auVar155._4_4_ * auVar155._4_4_;
        auVar66._0_4_ = auVar155._0_4_ * auVar155._0_4_;
        auVar66._8_4_ = auVar155._8_4_ * auVar155._8_4_;
        auVar66._12_4_ = auVar155._12_4_ * auVar155._12_4_;
        auVar66._16_4_ = auVar155._16_4_ * auVar155._16_4_;
        auVar66._20_4_ = auVar155._20_4_ * auVar155._20_4_;
        auVar66._24_4_ = auVar155._24_4_ * auVar155._24_4_;
        auVar66._28_4_ = auVar155._28_4_;
        local_8e0 = vsubps_avx(local_920,auVar66);
        auVar67._4_4_ = local_8e0._4_4_ * fVar126 * 4.0;
        auVar67._0_4_ = local_8e0._0_4_ * fVar125 * 4.0;
        auVar67._8_4_ = local_8e0._8_4_ * fVar127 * 4.0;
        auVar67._12_4_ = local_8e0._12_4_ * fVar128 * 4.0;
        auVar67._16_4_ = local_8e0._16_4_ * fVar345 * 4.0;
        auVar67._20_4_ = local_8e0._20_4_ * fVar347 * 4.0;
        auVar67._24_4_ = local_8e0._24_4_ * fVar349 * 4.0;
        auVar67._28_4_ = auVar155._28_4_;
        auVar13 = vsubps_avx(auVar49,auVar67);
        auVar155 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar155 >> 0x7f,0) == '\0') &&
              (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar155 >> 0xbf,0) == '\0') &&
            (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar155[0x1f]) {
          auVar167 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          _local_8a0 = ZEXT832(0) << 0x20;
          auVar193 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar218 = ZEXT828(0) << 0x20;
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar277._8_4_ = 0xff800000;
          auVar277._0_8_ = 0xff800000ff800000;
          auVar277._12_4_ = 0xff800000;
          auVar277._16_4_ = 0xff800000;
          auVar277._20_4_ = 0xff800000;
          auVar277._24_4_ = 0xff800000;
          auVar277._28_4_ = 0xff800000;
          local_8e0 = auVar28;
          _local_860 = _local_880;
        }
        else {
          auVar167 = vsqrtps_avx(auVar13);
          auVar199._0_4_ = fVar125 + fVar125;
          auVar199._4_4_ = fVar126 + fVar126;
          auVar199._8_4_ = fVar127 + fVar127;
          auVar199._12_4_ = fVar128 + fVar128;
          auVar199._16_4_ = fVar345 + fVar345;
          auVar199._20_4_ = fVar347 + fVar347;
          auVar199._24_4_ = fVar349 + fVar349;
          auVar199._28_4_ = fVar202 + fVar202;
          auVar14 = vrcpps_avx(auVar199);
          fVar202 = auVar14._0_4_;
          fVar205 = auVar14._4_4_;
          auVar68._4_4_ = auVar199._4_4_ * fVar205;
          auVar68._0_4_ = auVar199._0_4_ * fVar202;
          fVar206 = auVar14._8_4_;
          auVar68._8_4_ = auVar199._8_4_ * fVar206;
          fVar207 = auVar14._12_4_;
          auVar68._12_4_ = auVar199._12_4_ * fVar207;
          fVar208 = auVar14._16_4_;
          auVar68._16_4_ = auVar199._16_4_ * fVar208;
          fVar224 = auVar14._20_4_;
          auVar68._20_4_ = auVar199._20_4_ * fVar224;
          fVar227 = auVar14._24_4_;
          auVar68._24_4_ = auVar199._24_4_ * fVar227;
          auVar68._28_4_ = auVar199._28_4_;
          auVar328 = vsubps_avx(auVar354,auVar68);
          fVar202 = fVar202 + fVar202 * auVar328._0_4_;
          fVar205 = fVar205 + fVar205 * auVar328._4_4_;
          fVar206 = fVar206 + fVar206 * auVar328._8_4_;
          fVar207 = fVar207 + fVar207 * auVar328._12_4_;
          fVar208 = fVar208 + fVar208 * auVar328._16_4_;
          fVar224 = fVar224 + fVar224 * auVar328._20_4_;
          fVar227 = fVar227 + fVar227 * auVar328._24_4_;
          fVar229 = auVar14._28_4_ + auVar328._28_4_;
          auVar220._0_8_ = local_940._0_8_ ^ 0x8000000080000000;
          auVar220._8_4_ = -local_940._8_4_;
          auVar220._12_4_ = -local_940._12_4_;
          auVar220._16_4_ = -local_940._16_4_;
          auVar220._20_4_ = -local_940._20_4_;
          auVar220._24_4_ = -local_940._24_4_;
          auVar220._28_4_ = -local_940._28_4_;
          auVar14 = vsubps_avx(auVar220,auVar167);
          fVar230 = auVar14._0_4_ * fVar202;
          fVar253 = auVar14._4_4_ * fVar205;
          auVar69._4_4_ = fVar253;
          auVar69._0_4_ = fVar230;
          fVar255 = auVar14._8_4_ * fVar206;
          auVar69._8_4_ = fVar255;
          fVar257 = auVar14._12_4_ * fVar207;
          auVar69._12_4_ = fVar257;
          fVar259 = auVar14._16_4_ * fVar208;
          auVar69._16_4_ = fVar259;
          fVar261 = auVar14._20_4_ * fVar224;
          auVar69._20_4_ = fVar261;
          fVar282 = auVar14._24_4_ * fVar227;
          auVar69._24_4_ = fVar282;
          auVar69._28_4_ = auVar3._12_4_;
          auVar167 = vsubps_avx(auVar167,local_940);
          fVar202 = auVar167._0_4_ * fVar202;
          fVar205 = auVar167._4_4_ * fVar205;
          auVar70._4_4_ = fVar205;
          auVar70._0_4_ = fVar202;
          fVar206 = auVar167._8_4_ * fVar206;
          auVar70._8_4_ = fVar206;
          fVar207 = auVar167._12_4_ * fVar207;
          auVar70._12_4_ = fVar207;
          fVar208 = auVar167._16_4_ * fVar208;
          auVar70._16_4_ = fVar208;
          fVar224 = auVar167._20_4_ * fVar224;
          auVar70._20_4_ = fVar224;
          fVar227 = auVar167._24_4_ * fVar227;
          auVar70._24_4_ = fVar227;
          auVar70._28_4_ = auVar24._12_4_;
          fVar231 = (fVar230 * fVar335 + local_9e0) * local_4c0;
          fVar233 = (fVar253 * fVar341 + fStack_9dc) * fStack_4bc;
          fVar252 = (fVar255 * fVar342 + fStack_9d8) * fStack_4b8;
          fVar258 = (fVar257 * fVar343 + fStack_9d4) * fStack_4b4;
          fVar260 = (fVar259 * fVar344 + fStack_9d0) * fStack_4b0;
          fVar262 = (fVar261 * fVar346 + fStack_9cc) * fStack_4ac;
          fVar228 = (fVar282 * fVar348 + fStack_9c8) * fStack_4a8;
          local_a20._28_4_ = auVar16._28_4_;
          auVar168._0_4_ = auVar382._0_4_ + fVar204 * fVar231;
          auVar168._4_4_ = auVar382._4_4_ + fVar226 * fVar233;
          auVar168._8_4_ = auVar382._8_4_ + fVar256 * fVar252;
          auVar168._12_4_ = auVar382._12_4_ + fVar234 * fVar258;
          auVar168._16_4_ = auVar382._16_4_ + fVar264 * fVar260;
          auVar168._20_4_ = auVar382._20_4_ + fVar322 * fVar262;
          auVar168._24_4_ = auVar382._24_4_ + fVar18 * fVar228;
          auVar168._28_4_ = auVar382._28_4_ + auVar167._28_4_ + fStack_9c4;
          auVar71._4_4_ = fVar253 * (float)local_800._4_4_;
          auVar71._0_4_ = fVar230 * (float)local_800._0_4_;
          auVar71._8_4_ = fVar255 * fStack_7f8;
          auVar71._12_4_ = fVar257 * fStack_7f4;
          auVar71._16_4_ = fVar259 * fStack_7f0;
          auVar71._20_4_ = fVar261 * fStack_7ec;
          auVar71._24_4_ = fVar282 * fStack_7e8;
          auVar71._28_4_ = fVar229;
          auVar167 = vsubps_avx(auVar71,auVar168);
          auVar200._0_4_ = auVar394._0_4_ + fVar203 * fVar231;
          auVar200._4_4_ = auVar394._4_4_ + fVar225 * fVar233;
          auVar200._8_4_ = auVar394._8_4_ + fVar254 * fVar252;
          auVar200._12_4_ = auVar394._12_4_ + fVar232 * fVar258;
          auVar200._16_4_ = auVar394._16_4_ + fVar263 * fVar260;
          auVar200._20_4_ = auVar394._20_4_ + fVar297 * fVar262;
          auVar200._24_4_ = auVar394._24_4_ + fVar392 * fVar228;
          auVar200._28_4_ = auVar394._28_4_ + fVar229;
          auVar248._0_4_ = (float)local_820._0_4_ * fVar230;
          auVar248._4_4_ = (float)local_820._4_4_ * fVar253;
          auVar248._8_4_ = fStack_818 * fVar255;
          auVar248._12_4_ = fStack_814 * fVar257;
          auVar248._16_4_ = fStack_810 * fVar259;
          auVar248._20_4_ = fStack_80c * fVar261;
          auVar248._24_4_ = fStack_808 * fVar282;
          auVar248._28_4_ = 0;
          _local_a00 = vsubps_avx(auVar248,auVar200);
          auVar221._0_4_ = auVar399._0_4_ + fVar357 * fVar231;
          auVar221._4_4_ = auVar399._4_4_ + fVar363 * fVar233;
          auVar221._8_4_ = auVar399._8_4_ + fVar364 * fVar252;
          auVar221._12_4_ = auVar399._12_4_ + fVar365 * fVar258;
          auVar221._16_4_ = auVar399._16_4_ + fVar366 * fVar260;
          auVar221._20_4_ = auVar399._20_4_ + fVar367 * fVar262;
          auVar221._24_4_ = auVar399._24_4_ + fVar368 * fVar228;
          auVar221._28_4_ = auVar399._28_4_ + auVar14._28_4_;
          auVar72._4_4_ = (float)local_7e0._4_4_ * fVar253;
          auVar72._0_4_ = (float)local_7e0._0_4_ * fVar230;
          auVar72._8_4_ = fStack_7d8 * fVar255;
          auVar72._12_4_ = fStack_7d4 * fVar257;
          auVar72._16_4_ = fStack_7d0 * fVar259;
          auVar72._20_4_ = fStack_7cc * fVar261;
          auVar72._24_4_ = fStack_7c8 * fVar282;
          auVar72._28_4_ = 0;
          auVar14 = vsubps_avx(auVar72,auVar221);
          auVar218 = auVar14._0_28_;
          fVar229 = (fVar202 * fVar335 + local_9e0) * local_4c0;
          fVar231 = (fVar205 * fVar341 + fStack_9dc) * fStack_4bc;
          fVar233 = (fVar206 * fVar342 + fStack_9d8) * fStack_4b8;
          fVar252 = (fVar207 * fVar343 + fStack_9d4) * fStack_4b4;
          fVar258 = (fVar208 * fVar344 + fStack_9d0) * fStack_4b0;
          fVar260 = (fVar224 * fVar346 + fStack_9cc) * fStack_4ac;
          fVar262 = (fVar227 * fVar348 + fStack_9c8) * fStack_4a8;
          auVar278._0_4_ = auVar382._0_4_ + fVar204 * fVar229;
          auVar278._4_4_ = auVar382._4_4_ + fVar226 * fVar231;
          auVar278._8_4_ = auVar382._8_4_ + fVar256 * fVar233;
          auVar278._12_4_ = auVar382._12_4_ + fVar234 * fVar252;
          auVar278._16_4_ = auVar382._16_4_ + fVar264 * fVar258;
          auVar278._20_4_ = auVar382._20_4_ + fVar322 * fVar260;
          auVar278._24_4_ = auVar382._24_4_ + fVar18 * fVar262;
          auVar278._28_4_ = auVar382._28_4_ + (float)local_a20._28_4_;
          auVar73._4_4_ = fVar205 * (float)local_800._4_4_;
          auVar73._0_4_ = fVar202 * (float)local_800._0_4_;
          auVar73._8_4_ = fVar206 * fStack_7f8;
          auVar73._12_4_ = fVar207 * fStack_7f4;
          auVar73._16_4_ = fVar208 * fStack_7f0;
          auVar73._20_4_ = fVar224 * fStack_7ec;
          auVar73._24_4_ = fVar227 * fStack_7e8;
          auVar73._28_4_ = fStack_7e4;
          _local_860 = vsubps_avx(auVar73,auVar278);
          auVar279._0_4_ = auVar394._0_4_ + fVar203 * fVar229;
          auVar279._4_4_ = auVar394._4_4_ + fVar225 * fVar231;
          auVar279._8_4_ = auVar394._8_4_ + fVar254 * fVar233;
          auVar279._12_4_ = auVar394._12_4_ + fVar232 * fVar252;
          auVar279._16_4_ = auVar394._16_4_ + fVar263 * fVar258;
          auVar279._20_4_ = auVar394._20_4_ + fVar297 * fVar260;
          auVar279._24_4_ = auVar394._24_4_ + fVar392 * fVar262;
          auVar279._28_4_ = auVar394._28_4_ + local_860._28_4_;
          auVar74._4_4_ = (float)local_820._4_4_ * fVar205;
          auVar74._0_4_ = (float)local_820._0_4_ * fVar202;
          auVar74._8_4_ = fStack_818 * fVar206;
          auVar74._12_4_ = fStack_814 * fVar207;
          auVar74._16_4_ = fStack_810 * fVar208;
          auVar74._20_4_ = fStack_80c * fVar224;
          auVar74._24_4_ = fStack_808 * fVar227;
          auVar74._28_4_ = fStack_7e4;
          _local_880 = vsubps_avx(auVar74,auVar279);
          auVar249._0_4_ = auVar399._0_4_ + fVar357 * fVar229;
          auVar249._4_4_ = auVar399._4_4_ + fVar363 * fVar231;
          auVar249._8_4_ = auVar399._8_4_ + fVar364 * fVar233;
          auVar249._12_4_ = auVar399._12_4_ + fVar365 * fVar252;
          auVar249._16_4_ = auVar399._16_4_ + fVar366 * fVar258;
          auVar249._20_4_ = auVar399._20_4_ + fVar367 * fVar260;
          auVar249._24_4_ = auVar399._24_4_ + fVar368 * fVar262;
          auVar249._28_4_ = auVar399._28_4_ + fStack_9c4 + 0.0;
          auVar75._4_4_ = (float)local_7e0._4_4_ * fVar205;
          auVar75._0_4_ = (float)local_7e0._0_4_ * fVar202;
          auVar75._8_4_ = fStack_7d8 * fVar206;
          auVar75._12_4_ = fStack_7d4 * fVar207;
          auVar75._16_4_ = fStack_7d0 * fVar208;
          auVar75._20_4_ = fStack_7cc * fVar224;
          auVar75._24_4_ = fStack_7c8 * fVar227;
          auVar75._28_4_ = local_880._28_4_;
          _local_8a0 = vsubps_avx(auVar75,auVar249);
          auVar14 = vcmpps_avx(auVar13,auVar340,5);
          auVar250._8_4_ = 0x7f800000;
          auVar250._0_8_ = 0x7f8000007f800000;
          auVar250._12_4_ = 0x7f800000;
          auVar250._16_4_ = 0x7f800000;
          auVar250._20_4_ = 0x7f800000;
          auVar250._24_4_ = 0x7f800000;
          auVar250._28_4_ = 0x7f800000;
          auVar247 = vblendvps_avx(auVar250,auVar69,auVar14);
          auVar355._8_4_ = 0x7fffffff;
          auVar355._0_8_ = 0x7fffffff7fffffff;
          auVar355._12_4_ = 0x7fffffff;
          auVar355._16_4_ = 0x7fffffff;
          auVar355._20_4_ = 0x7fffffff;
          auVar355._24_4_ = 0x7fffffff;
          auVar355._28_4_ = 0x7fffffff;
          auVar13 = vandps_avx(auVar355,local_380);
          auVar13 = vmaxps_avx(local_460,auVar13);
          auVar76._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar76._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar76._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar76._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar76._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar76._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar76._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar76._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar355,local_4e0);
          auVar13 = vcmpps_avx(auVar13,auVar76,1);
          auVar280._8_4_ = 0xff800000;
          auVar280._0_8_ = 0xff800000ff800000;
          auVar280._12_4_ = 0xff800000;
          auVar280._16_4_ = 0xff800000;
          auVar280._20_4_ = 0xff800000;
          auVar280._24_4_ = 0xff800000;
          auVar280._28_4_ = 0xff800000;
          auVar277 = vblendvps_avx(auVar280,auVar70,auVar14);
          auVar340 = auVar14 & auVar13;
          if ((((((((auVar340 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar340 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar340 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar340 >> 0x7f,0) != '\0') ||
                (auVar340 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar340 >> 0xbf,0) != '\0') ||
              (auVar340 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar340[0x1f] < '\0') {
            auVar155 = vandps_avx(auVar13,auVar14);
            auVar237 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
            auVar328 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar340 = vcmpps_avx(local_8e0,auVar328,2);
            auVar397._8_4_ = 0xff800000;
            auVar397._0_8_ = 0xff800000ff800000;
            auVar397._12_4_ = 0xff800000;
            auVar397._16_4_ = 0xff800000;
            auVar397._20_4_ = 0xff800000;
            auVar397._24_4_ = 0xff800000;
            auVar397._28_4_ = 0xff800000;
            auVar401._8_4_ = 0x7f800000;
            auVar401._0_8_ = 0x7f8000007f800000;
            auVar401._12_4_ = 0x7f800000;
            auVar401._16_4_ = 0x7f800000;
            auVar401._20_4_ = 0x7f800000;
            auVar401._24_4_ = 0x7f800000;
            auVar401._28_4_ = 0x7f800000;
            auVar13 = vblendvps_avx(auVar401,auVar397,auVar340);
            auVar190 = vpmovsxwd_avx(auVar237);
            auVar237 = vpunpckhwd_avx(auVar237,auVar237);
            auVar356._16_16_ = auVar237;
            auVar356._0_16_ = auVar190;
            auVar247 = vblendvps_avx(auVar247,auVar13,auVar356);
            auVar13 = vblendvps_avx(auVar397,auVar401,auVar340);
            auVar277 = vblendvps_avx(auVar277,auVar13,auVar356);
            auVar13 = vcmpps_avx(auVar328,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar118._0_4_ = auVar13._0_4_ ^ auVar155._0_4_;
            auVar118._4_4_ = auVar13._4_4_ ^ auVar155._4_4_;
            auVar118._8_4_ = auVar13._8_4_ ^ auVar155._8_4_;
            auVar118._12_4_ = auVar13._12_4_ ^ auVar155._12_4_;
            auVar118._16_4_ = auVar13._16_4_ ^ auVar155._16_4_;
            auVar118._20_4_ = auVar13._20_4_ ^ auVar155._20_4_;
            auVar118._24_4_ = auVar13._24_4_ ^ auVar155._24_4_;
            auVar118._28_4_ = auVar13._28_4_ ^ auVar155._28_4_;
            auVar155 = vorps_avx(auVar340,auVar118);
            auVar155 = vandps_avx(auVar14,auVar155);
          }
          auVar193 = local_a00._0_28_;
          local_aa0 = auVar167;
        }
        _local_400 = _local_720;
        local_3e0 = vminps_avx(local_3a0,auVar247);
        _local_740 = vmaxps_avx(_local_720,auVar277);
        local_3c0 = _local_740;
        auVar13 = vcmpps_avx(_local_720,local_3e0,2);
        local_680 = vandps_avx(auVar101,auVar13);
        auVar13 = vcmpps_avx(_local_740,local_3a0,2);
        local_760 = vandps_avx(auVar101,auVar13);
        auVar101 = vorps_avx(local_760,local_680);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0x7f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0xbf,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0x1f] < '\0') {
          local_a20 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6c0._0_4_ = auVar155._0_4_ ^ local_a20._0_4_;
          local_6c0._4_4_ = auVar155._4_4_ ^ local_a20._4_4_;
          local_6c0._8_4_ = auVar155._8_4_ ^ local_a20._8_4_;
          local_6c0._12_4_ = auVar155._12_4_ ^ local_a20._12_4_;
          local_6c0._16_4_ = auVar155._16_4_ ^ local_a20._16_4_;
          local_6c0._20_4_ = auVar155._20_4_ ^ local_a20._20_4_;
          local_6c0._24_4_ = auVar155._24_4_ ^ local_a20._24_4_;
          local_6c0._28_4_ = (uint)auVar155._28_4_ ^ (uint)local_a20._28_4_;
          auVar109._0_4_ =
               auVar167._0_4_ * (float)local_800._0_4_ +
               auVar193._0_4_ * (float)local_820._0_4_ + (float)local_7e0._0_4_ * auVar218._0_4_;
          auVar109._4_4_ =
               auVar167._4_4_ * (float)local_800._4_4_ +
               auVar193._4_4_ * (float)local_820._4_4_ + (float)local_7e0._4_4_ * auVar218._4_4_;
          auVar109._8_4_ =
               auVar167._8_4_ * fStack_7f8 +
               auVar193._8_4_ * fStack_818 + fStack_7d8 * auVar218._8_4_;
          auVar109._12_4_ =
               auVar167._12_4_ * fStack_7f4 +
               auVar193._12_4_ * fStack_814 + fStack_7d4 * auVar218._12_4_;
          auVar109._16_4_ =
               auVar167._16_4_ * fStack_7f0 +
               auVar193._16_4_ * fStack_810 + fStack_7d0 * auVar218._16_4_;
          auVar109._20_4_ =
               auVar167._20_4_ * fStack_7ec +
               auVar193._20_4_ * fStack_80c + fStack_7cc * auVar218._20_4_;
          auVar109._24_4_ =
               auVar167._24_4_ * fStack_7e8 +
               auVar193._24_4_ * fStack_808 + fStack_7c8 * auVar218._24_4_;
          auVar109._28_4_ = auVar155._28_4_ + local_a20._28_4_ + auVar167._28_4_;
          auVar150._8_4_ = 0x7fffffff;
          auVar150._0_8_ = 0x7fffffff7fffffff;
          auVar150._12_4_ = 0x7fffffff;
          auVar150._16_4_ = 0x7fffffff;
          auVar150._20_4_ = 0x7fffffff;
          auVar150._24_4_ = 0x7fffffff;
          auVar150._28_4_ = 0x7fffffff;
          auVar101 = vandps_avx(auVar109,auVar150);
          auVar151._8_4_ = 0x3e99999a;
          auVar151._0_8_ = 0x3e99999a3e99999a;
          auVar151._12_4_ = 0x3e99999a;
          auVar151._16_4_ = 0x3e99999a;
          auVar151._20_4_ = 0x3e99999a;
          auVar151._24_4_ = 0x3e99999a;
          auVar151._28_4_ = 0x3e99999a;
          auVar101 = vcmpps_avx(auVar101,auVar151,1);
          auVar101 = vorps_avx(auVar101,local_6c0);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar101 = vblendvps_avx(auVar169,auVar152,auVar101);
          local_6e0 = ZEXT432(local_cc8);
          local_700 = vpshufd_avx(ZEXT416(local_cc8),0);
          auVar237 = vpcmpgtd_avx(auVar101._16_16_,local_700);
          auStack_6f0 = auVar15._16_16_;
          auVar190 = vpcmpgtd_avx(auVar101._0_16_,local_700);
          auVar153._16_16_ = auVar237;
          auVar153._0_16_ = auVar190;
          local_6a0 = vblendps_avx(ZEXT1632(auVar190),auVar153,0xf0);
          local_640 = vandnps_avx(local_6a0,local_680);
          auVar362 = ZEXT3264(local_640);
          auVar101 = local_680 & ~local_6a0;
          auVar281 = ZEXT3264(local_a80);
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0x7f,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0xbf,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar101[0x1f]) {
            auVar237 = vshufps_avx(local_620,local_620,0);
            auVar110._16_16_ = auVar237;
            auVar110._0_16_ = auVar237;
            auVar218 = local_800._0_28_;
          }
          else {
            local_920._0_4_ = uVar83;
            local_960._4_4_ = (float)local_720._4_4_ + local_900._4_4_;
            local_960._0_4_ = (float)local_720._0_4_ + (float)local_900;
            fStack_958 = fStack_718 + (float)uStack_8f8;
            fStack_954 = fStack_714 + uStack_8f8._4_4_;
            fStack_950 = fStack_710 + (float)uStack_8f0;
            fStack_94c = fStack_70c + uStack_8f0._4_4_;
            fStack_948 = fStack_708 + (float)uStack_8e8;
            fStack_944 = fStack_704 + uStack_8e8._4_4_;
            do {
              auVar111._8_4_ = 0x7f800000;
              auVar111._0_8_ = 0x7f8000007f800000;
              auVar111._12_4_ = 0x7f800000;
              auVar111._16_4_ = 0x7f800000;
              auVar111._20_4_ = 0x7f800000;
              auVar111._24_4_ = 0x7f800000;
              auVar111._28_4_ = 0x7f800000;
              auVar101 = auVar362._0_32_;
              auVar155 = vblendvps_avx(auVar111,_local_720,auVar101);
              auVar13 = vshufps_avx(auVar155,auVar155,0xb1);
              auVar13 = vminps_avx(auVar155,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar155 = vcmpps_avx(auVar155,auVar13,0);
              auVar13 = auVar101 & auVar155;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar101 = vandps_avx(auVar155,auVar101);
              }
              uVar84 = vmovmskps_avx(auVar101);
              uVar83 = 0;
              if (uVar84 != 0) {
                for (; (uVar84 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
              uVar82 = (ulong)uVar83;
              *(undefined4 *)(local_640 + uVar82 * 4) = 0;
              fVar202 = local_1a0[uVar82];
              uVar83 = *(uint *)(local_400 + uVar82 * 4);
              fVar203 = auVar132._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar203 = sqrtf((float)local_980._0_4_);
              }
              auVar190 = vminps_avx(_local_ae0,_local_b00);
              auVar237 = vmaxps_avx(_local_ae0,_local_b00);
              auVar6 = vminps_avx(_local_af0,_local_b10);
              auVar98 = vminps_avx(auVar190,auVar6);
              auVar190 = vmaxps_avx(_local_af0,_local_b10);
              auVar6 = vmaxps_avx(auVar237,auVar190);
              auVar179._8_4_ = 0x7fffffff;
              auVar179._0_8_ = 0x7fffffff7fffffff;
              auVar179._12_4_ = 0x7fffffff;
              auVar237 = vandps_avx(auVar98,auVar179);
              auVar190 = vandps_avx(auVar6,auVar179);
              auVar237 = vmaxps_avx(auVar237,auVar190);
              auVar190 = vmovshdup_avx(auVar237);
              auVar190 = vmaxss_avx(auVar190,auVar237);
              auVar237 = vshufpd_avx(auVar237,auVar237,1);
              auVar237 = vmaxss_avx(auVar237,auVar190);
              local_aa0._0_4_ = auVar237._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar203 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar6,auVar6,0xff);
              auVar237 = vinsertps_avx(ZEXT416(uVar83),ZEXT416((uint)fVar202),0x10);
              lVar89 = 5;
              do {
                auVar190 = vmovshdup_avx(auVar237);
                fVar233 = auVar190._0_4_;
                fVar206 = 1.0 - fVar233;
                auVar190 = vshufps_avx(auVar237,auVar237,0x55);
                fVar202 = auVar190._0_4_;
                fVar203 = auVar190._4_4_;
                fVar204 = auVar190._8_4_;
                fVar205 = auVar190._12_4_;
                auVar190 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
                fVar207 = auVar190._0_4_;
                fVar208 = auVar190._4_4_;
                fVar224 = auVar190._8_4_;
                fVar225 = auVar190._12_4_;
                fVar226 = (float)local_af0._0_4_ * fVar202 + (float)local_b00._0_4_ * fVar207;
                fVar227 = (float)local_af0._4_4_ * fVar203 + (float)local_b00._4_4_ * fVar208;
                fVar229 = fStack_ae8 * fVar204 + fStack_af8 * fVar224;
                fVar231 = fStack_ae4 * fVar205 + fStack_af4 * fVar225;
                auVar238._0_4_ =
                     fVar207 * ((float)local_b00._0_4_ * fVar202 + fVar207 * (float)local_ae0._0_4_)
                     + fVar202 * fVar226;
                auVar238._4_4_ =
                     fVar208 * ((float)local_b00._4_4_ * fVar203 + fVar208 * (float)local_ae0._4_4_)
                     + fVar203 * fVar227;
                auVar238._8_4_ =
                     fVar224 * (fStack_af8 * fVar204 + fVar224 * fStack_ad8) + fVar204 * fVar229;
                auVar238._12_4_ =
                     fVar225 * (fStack_af4 * fVar205 + fVar225 * fStack_ad4) + fVar205 * fVar231;
                auVar180._0_4_ =
                     fVar207 * fVar226 +
                     fVar202 * (fVar202 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar207)
                ;
                auVar180._4_4_ =
                     fVar208 * fVar227 +
                     fVar203 * (fVar203 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar208)
                ;
                auVar180._8_4_ =
                     fVar224 * fVar229 + fVar204 * (fVar204 * fStack_b08 + fStack_ae8 * fVar224);
                auVar180._12_4_ =
                     fVar225 * fVar231 + fVar205 * (fVar205 * fStack_b04 + fStack_ae4 * fVar225);
                auVar190 = vshufps_avx(auVar237,auVar237,0);
                auVar133._0_4_ = auVar190._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar133._4_4_ = auVar190._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar133._8_4_ = auVar190._8_4_ * fStack_968 + 0.0;
                auVar133._12_4_ = auVar190._12_4_ * fStack_964 + 0.0;
                auVar95._0_4_ = fVar207 * auVar238._0_4_ + fVar202 * auVar180._0_4_;
                auVar95._4_4_ = fVar208 * auVar238._4_4_ + fVar203 * auVar180._4_4_;
                auVar95._8_4_ = fVar224 * auVar238._8_4_ + fVar204 * auVar180._8_4_;
                auVar95._12_4_ = fVar225 * auVar238._12_4_ + fVar205 * auVar180._12_4_;
                local_8e0._0_16_ = auVar95;
                auVar190 = vsubps_avx(auVar133,auVar95);
                _local_a00 = auVar190;
                auVar190 = vdpps_avx(auVar190,auVar190,0x7f);
                fVar202 = auVar190._0_4_;
                if (fVar202 < 0.0) {
                  fVar203 = sqrtf(fVar202);
                }
                else {
                  auVar6 = vsqrtss_avx(auVar190,auVar190);
                  fVar203 = auVar6._0_4_;
                }
                auVar6 = vsubps_avx(auVar180,auVar238);
                auVar268._0_4_ = auVar6._0_4_ * 3.0;
                auVar268._4_4_ = auVar6._4_4_ * 3.0;
                auVar268._8_4_ = auVar6._8_4_ * 3.0;
                auVar268._12_4_ = auVar6._12_4_ * 3.0;
                auVar6 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0)),0
                                    );
                auVar98 = ZEXT416((uint)((fVar206 - (fVar233 + fVar233)) * 6.0));
                auVar161 = vshufps_avx(auVar98,auVar98,0);
                auVar98 = ZEXT416((uint)((fVar233 - (fVar206 + fVar206)) * 6.0));
                auVar187 = vshufps_avx(auVar98,auVar98,0);
                auVar92 = vshufps_avx(ZEXT416((uint)(fVar206 * 6.0)),ZEXT416((uint)(fVar206 * 6.0)),
                                      0);
                auVar98 = vdpps_avx(auVar268,auVar268,0x7f);
                auVar134._0_4_ =
                     auVar92._0_4_ * (float)local_ae0._0_4_ +
                     auVar187._0_4_ * (float)local_b00._0_4_ +
                     auVar6._0_4_ * (float)local_b10._0_4_ + auVar161._0_4_ * (float)local_af0._0_4_
                ;
                auVar134._4_4_ =
                     auVar92._4_4_ * (float)local_ae0._4_4_ +
                     auVar187._4_4_ * (float)local_b00._4_4_ +
                     auVar6._4_4_ * (float)local_b10._4_4_ + auVar161._4_4_ * (float)local_af0._4_4_
                ;
                auVar134._8_4_ =
                     auVar92._8_4_ * fStack_ad8 +
                     auVar187._8_4_ * fStack_af8 +
                     auVar6._8_4_ * fStack_b08 + auVar161._8_4_ * fStack_ae8;
                auVar134._12_4_ =
                     auVar92._12_4_ * fStack_ad4 +
                     auVar187._12_4_ * fStack_af4 +
                     auVar6._12_4_ * fStack_b04 + auVar161._12_4_ * fStack_ae4;
                auVar6 = vblendps_avx(auVar98,_DAT_01f7aa10,0xe);
                auVar161 = vrsqrtss_avx(auVar6,auVar6);
                fVar205 = auVar161._0_4_;
                fVar204 = auVar98._0_4_;
                auVar161 = vdpps_avx(auVar268,auVar134,0x7f);
                auVar187 = vshufps_avx(auVar98,auVar98,0);
                auVar135._0_4_ = auVar134._0_4_ * auVar187._0_4_;
                auVar135._4_4_ = auVar134._4_4_ * auVar187._4_4_;
                auVar135._8_4_ = auVar134._8_4_ * auVar187._8_4_;
                auVar135._12_4_ = auVar134._12_4_ * auVar187._12_4_;
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                auVar210._0_4_ = auVar268._0_4_ * auVar161._0_4_;
                auVar210._4_4_ = auVar268._4_4_ * auVar161._4_4_;
                auVar210._8_4_ = auVar268._8_4_ * auVar161._8_4_;
                auVar210._12_4_ = auVar268._12_4_ * auVar161._12_4_;
                auVar92 = vsubps_avx(auVar135,auVar210);
                auVar161 = vrcpss_avx(auVar6,auVar6);
                auVar6 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                    ZEXT416((uint)(auVar237._0_4_ * (float)local_780._0_4_)));
                auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar204 * auVar161._0_4_)));
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                uVar82 = CONCAT44(auVar268._4_4_,auVar268._0_4_);
                auVar323._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar323._8_4_ = -auVar268._8_4_;
                auVar323._12_4_ = -auVar268._12_4_;
                auVar187 = ZEXT416((uint)(fVar205 * 1.5 +
                                         fVar204 * -0.5 * fVar205 * fVar205 * fVar205));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar181._0_4_ = auVar187._0_4_ * auVar92._0_4_ * auVar161._0_4_;
                auVar181._4_4_ = auVar187._4_4_ * auVar92._4_4_ * auVar161._4_4_;
                auVar181._8_4_ = auVar187._8_4_ * auVar92._8_4_ * auVar161._8_4_;
                auVar181._12_4_ = auVar187._12_4_ * auVar92._12_4_ * auVar161._12_4_;
                local_9a0._0_4_ = auVar268._0_4_ * auVar187._0_4_;
                local_9a0._4_4_ = auVar268._4_4_ * auVar187._4_4_;
                local_9a0._8_4_ = auVar268._8_4_ * auVar187._8_4_;
                local_9a0._12_4_ = auVar268._12_4_ * auVar187._12_4_;
                if (fVar204 < 0.0) {
                  local_9c0._0_16_ = auVar181;
                  fVar204 = sqrtf(fVar204);
                  auVar181 = local_9c0._0_16_;
                }
                else {
                  auVar98 = vsqrtss_avx(auVar98,auVar98);
                  fVar204 = auVar98._0_4_;
                }
                auVar98 = vdpps_avx(_local_a00,local_9a0._0_16_,0x7f);
                fVar203 = ((float)local_aa0._0_4_ / fVar204) * (fVar203 + 1.0) +
                          fVar203 * (float)local_aa0._0_4_ + auVar6._0_4_;
                auVar161 = vdpps_avx(auVar323,local_9a0._0_16_,0x7f);
                auVar187 = vdpps_avx(_local_a00,auVar181,0x7f);
                auVar92 = vdpps_avx(_local_970,local_9a0._0_16_,0x7f);
                auVar130 = vdpps_avx(_local_a00,auVar323,0x7f);
                fVar204 = auVar161._0_4_ + auVar187._0_4_;
                fVar205 = auVar98._0_4_;
                auVar96._0_4_ = fVar205 * fVar205;
                auVar96._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                auVar96._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                auVar96._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                auVar187 = vsubps_avx(auVar190,auVar96);
                local_9a0._0_16_ = ZEXT416((uint)fVar204);
                auVar161 = vdpps_avx(_local_a00,_local_970,0x7f);
                fVar206 = auVar130._0_4_ - fVar205 * fVar204;
                fVar205 = auVar161._0_4_ - fVar205 * auVar92._0_4_;
                auVar161 = vrsqrtss_avx(auVar187,auVar187);
                fVar207 = auVar187._0_4_;
                fVar204 = auVar161._0_4_;
                fVar204 = fVar204 * 1.5 + fVar207 * -0.5 * fVar204 * fVar204 * fVar204;
                if (fVar207 < 0.0) {
                  local_9c0._0_16_ = auVar92;
                  local_940._0_4_ = fVar205;
                  local_7a0._0_4_ = fVar204;
                  local_9e0 = fVar206;
                  fVar207 = sqrtf(fVar207);
                  fVar204 = (float)local_7a0._0_4_;
                  fVar206 = local_9e0;
                  fVar205 = (float)local_940._0_4_;
                  auVar92 = local_9c0._0_16_;
                }
                else {
                  auVar161 = vsqrtss_avx(auVar187,auVar187);
                  fVar207 = auVar161._0_4_;
                }
                auVar130 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar131 = vshufps_avx(auVar268,auVar268,0xff);
                fVar206 = fVar206 * fVar204 - auVar131._0_4_;
                auVar211._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar92._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar92._12_4_ ^ 0x80000000;
                auVar239._0_4_ = -fVar206;
                auVar239._4_4_ = 0x80000000;
                auVar239._8_4_ = 0x80000000;
                auVar239._12_4_ = 0x80000000;
                auVar161 = vinsertps_avx(auVar239,ZEXT416((uint)(fVar205 * fVar204)),0x1c);
                auVar92 = vmovsldup_avx(ZEXT416((uint)(local_9a0._0_4_ * fVar205 * fVar204 -
                                                      auVar92._0_4_ * fVar206)));
                auVar161 = vdivps_avx(auVar161,auVar92);
                auVar187 = vinsertps_avx(local_9a0._0_16_,auVar211,0x10);
                auVar187 = vdivps_avx(auVar187,auVar92);
                auVar92 = vmovsldup_avx(auVar98);
                auVar100 = ZEXT416((uint)(fVar207 - auVar130._0_4_));
                auVar130 = vmovsldup_avx(auVar100);
                auVar159._0_4_ = auVar92._0_4_ * auVar161._0_4_ + auVar130._0_4_ * auVar187._0_4_;
                auVar159._4_4_ = auVar92._4_4_ * auVar161._4_4_ + auVar130._4_4_ * auVar187._4_4_;
                auVar159._8_4_ = auVar92._8_4_ * auVar161._8_4_ + auVar130._8_4_ * auVar187._8_4_;
                auVar159._12_4_ =
                     auVar92._12_4_ * auVar161._12_4_ + auVar130._12_4_ * auVar187._12_4_;
                auVar237 = vsubps_avx(auVar237,auVar159);
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar98 = vandps_avx(auVar98,auVar160);
                if (auVar98._0_4_ < fVar203) {
                  auVar182._8_4_ = 0x7fffffff;
                  auVar182._0_8_ = 0x7fffffff7fffffff;
                  auVar182._12_4_ = 0x7fffffff;
                  auVar98 = vandps_avx(auVar100,auVar182);
                  if (auVar98._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar203 + auVar6._0_4_) {
                    fVar203 = auVar237._0_4_ + (float)local_8c0._0_4_;
                    auVar281 = ZEXT3264(local_a80);
                    if ((fVar203 < fVar177) ||
                       (fVar204 = *(float *)(ray + k * 4 + 0x100), fVar204 < fVar203)) break;
                    auVar6 = vmovshdup_avx(auVar237);
                    fVar205 = auVar6._0_4_;
                    if ((fVar205 < 0.0) || (1.0 < fVar205)) break;
                    auVar190 = vrsqrtss_avx(auVar190,auVar190);
                    fVar206 = auVar190._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar190 = ZEXT416((uint)(fVar206 * 1.5 +
                                             fVar202 * -0.5 * fVar206 * fVar206 * fVar206));
                    auVar190 = vshufps_avx(auVar190,auVar190,0);
                    auVar183._0_4_ = auVar190._0_4_ * (float)local_a00._0_4_;
                    auVar183._4_4_ = auVar190._4_4_ * (float)local_a00._4_4_;
                    auVar183._8_4_ = auVar190._8_4_ * fStack_9f8;
                    auVar183._12_4_ = auVar190._12_4_ * fStack_9f4;
                    auVar136._0_4_ = auVar268._0_4_ + auVar131._0_4_ * auVar183._0_4_;
                    auVar136._4_4_ = auVar268._4_4_ + auVar131._4_4_ * auVar183._4_4_;
                    auVar136._8_4_ = auVar268._8_4_ + auVar131._8_4_ * auVar183._8_4_;
                    auVar136._12_4_ = auVar268._12_4_ + auVar131._12_4_ * auVar183._12_4_;
                    auVar190 = vshufps_avx(auVar183,auVar183,0xc9);
                    auVar6 = vshufps_avx(auVar268,auVar268,0xc9);
                    auVar184._0_4_ = auVar6._0_4_ * auVar183._0_4_;
                    auVar184._4_4_ = auVar6._4_4_ * auVar183._4_4_;
                    auVar184._8_4_ = auVar6._8_4_ * auVar183._8_4_;
                    auVar184._12_4_ = auVar6._12_4_ * auVar183._12_4_;
                    auVar212._0_4_ = auVar268._0_4_ * auVar190._0_4_;
                    auVar212._4_4_ = auVar268._4_4_ * auVar190._4_4_;
                    auVar212._8_4_ = auVar268._8_4_ * auVar190._8_4_;
                    auVar212._12_4_ = auVar268._12_4_ * auVar190._12_4_;
                    auVar98 = vsubps_avx(auVar212,auVar184);
                    auVar190 = vshufps_avx(auVar98,auVar98,0xc9);
                    auVar6 = vshufps_avx(auVar136,auVar136,0xc9);
                    auVar213._0_4_ = auVar6._0_4_ * auVar190._0_4_;
                    auVar213._4_4_ = auVar6._4_4_ * auVar190._4_4_;
                    auVar213._8_4_ = auVar6._8_4_ * auVar190._8_4_;
                    auVar213._12_4_ = auVar6._12_4_ * auVar190._12_4_;
                    auVar190 = vshufps_avx(auVar98,auVar98,0xd2);
                    auVar137._0_4_ = auVar136._0_4_ * auVar190._0_4_;
                    auVar137._4_4_ = auVar136._4_4_ * auVar190._4_4_;
                    auVar137._8_4_ = auVar136._8_4_ * auVar190._8_4_;
                    auVar137._12_4_ = auVar136._12_4_ * auVar190._12_4_;
                    auVar190 = vsubps_avx(auVar213,auVar137);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar203;
                      uVar1 = vextractps_avx(auVar190,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar190,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar190._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar205;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(undefined4 *)(ray + k * 4 + 0x220) = local_920._0_4_;
                      *(uint *)(ray + k * 4 + 0x240) = uVar88;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar9 = context->user;
                    auStack_590 = vshufps_avx(auVar237,auVar237,0x55);
                    auStack_5f0 = vshufps_avx(auVar190,auVar190,0x55);
                    auStack_5d0 = vshufps_avx(auVar190,auVar190,0xaa);
                    auStack_5b0 = vshufps_avx(auVar190,auVar190,0);
                    local_600 = (RTCHitN  [16])auStack_5f0;
                    local_5e0 = auStack_5d0;
                    local_5c0 = auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = ZEXT832(0) << 0x20;
                    local_560 = local_4a0._0_8_;
                    uStack_558 = local_4a0._8_8_;
                    uStack_550 = local_4a0._16_8_;
                    uStack_548 = local_4a0._24_8_;
                    local_540 = local_480._0_8_;
                    uStack_538 = local_480._8_8_;
                    uStack_530 = local_480._16_8_;
                    uStack_528 = local_480._24_8_;
                    *(undefined8 *)(local_a30 + 8) = local_a20._0_8_;
                    *(undefined8 *)(local_a30 + 10) = local_a20._8_8_;
                    *(undefined8 *)(local_a30 + 0xc) = local_a20._16_8_;
                    *(undefined8 *)(local_a30 + 0xe) = local_a20._24_8_;
                    *(undefined8 *)local_a30 = local_a20._0_8_;
                    *(undefined8 *)(local_a30 + 2) = local_a20._8_8_;
                    *(undefined8 *)(local_a30 + 4) = local_a20._16_8_;
                    *(undefined8 *)(local_a30 + 6) = local_a20._24_8_;
                    local_520 = pRVar9->instID[0];
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    uStack_510 = local_520;
                    uStack_50c = local_520;
                    uStack_508 = local_520;
                    uStack_504 = local_520;
                    local_500 = pRVar9->instPrimID[0];
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    uStack_4f0 = local_500;
                    uStack_4ec = local_500;
                    uStack_4e8 = local_500;
                    uStack_4e4 = local_500;
                    *(float *)(ray + k * 4 + 0x100) = fVar203;
                    local_b40 = *local_a38;
                    local_b30 = *local_a40;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar8->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_600;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_ad0);
                      auVar281 = ZEXT3264(local_a80);
                    }
                    auVar237 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar190 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar170._16_16_ = auVar190;
                    auVar170._0_16_ = auVar237;
                    auVar101 = local_a20 & ~auVar170;
                    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0x7f,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0xbf,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar101[0x1f] < '\0') {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&local_ad0);
                        auVar281 = ZEXT3264(local_a80);
                      }
                      auVar237 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar190 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar112._16_16_ = auVar190;
                      auVar112._0_16_ = auVar237;
                      auVar101 = local_a20 & ~auVar112;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar101 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar101 >> 0x7f,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0xbf,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar101[0x1f] < '\0') {
                        auVar113._0_4_ = auVar237._0_4_ ^ local_a20._0_4_;
                        auVar113._4_4_ = auVar237._4_4_ ^ local_a20._4_4_;
                        auVar113._8_4_ = auVar237._8_4_ ^ local_a20._8_4_;
                        auVar113._12_4_ = auVar237._12_4_ ^ local_a20._12_4_;
                        auVar113._16_4_ = auVar190._0_4_ ^ local_a20._16_4_;
                        auVar113._20_4_ = auVar190._4_4_ ^ local_a20._20_4_;
                        auVar113._24_4_ = auVar190._8_4_ ^ local_a20._24_4_;
                        auVar113._28_4_ = auVar190._12_4_ ^ local_a20._28_4_;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar101;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar204;
                    break;
                  }
                }
                lVar89 = lVar89 + -1;
                auVar281 = ZEXT3264(local_a80);
              } while (lVar89 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar110._4_4_ = uVar1;
              auVar110._0_4_ = uVar1;
              auVar110._8_4_ = uVar1;
              auVar110._12_4_ = uVar1;
              auVar110._16_4_ = uVar1;
              auVar110._20_4_ = uVar1;
              auVar110._24_4_ = uVar1;
              auVar110._28_4_ = uVar1;
              auVar155 = vcmpps_avx(_local_960,auVar110,2);
              auVar101 = vandps_avx(auVar155,local_640);
              auVar362 = ZEXT3264(auVar101);
              auVar155 = local_640 & auVar155;
              auVar218 = local_800._0_28_;
              local_640 = auVar101;
            } while ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar155 >> 0x7f,0) != '\0') ||
                       (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar155 >> 0xbf,0) != '\0') ||
                     (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar155[0x1f] < '\0');
            auVar362 = ZEXT3264(local_3c0);
            uVar83 = local_920._0_4_;
          }
          auVar154._0_4_ =
               auVar218._0_4_ * (float)local_860._0_4_ +
               (float)local_820._0_4_ * (float)local_880._0_4_ +
               (float)local_7e0._0_4_ * (float)local_8a0._0_4_;
          auVar154._4_4_ =
               auVar218._4_4_ * (float)local_860._4_4_ +
               (float)local_820._4_4_ * (float)local_880._4_4_ +
               (float)local_7e0._4_4_ * (float)local_8a0._4_4_;
          auVar154._8_4_ =
               auVar218._8_4_ * fStack_858 + fStack_818 * fStack_878 + fStack_7d8 * fStack_898;
          auVar154._12_4_ =
               auVar218._12_4_ * fStack_854 + fStack_814 * fStack_874 + fStack_7d4 * fStack_894;
          auVar154._16_4_ =
               auVar218._16_4_ * fStack_850 + fStack_810 * fStack_870 + fStack_7d0 * fStack_890;
          auVar154._20_4_ =
               auVar218._20_4_ * fStack_84c + fStack_80c * fStack_86c + fStack_7cc * fStack_88c;
          auVar154._24_4_ =
               auVar218._24_4_ * fStack_848 + fStack_808 * fStack_868 + fStack_7c8 * fStack_888;
          auVar154._28_4_ = fStack_804 + fStack_804 + auVar362._28_4_;
          auVar171._8_4_ = 0x7fffffff;
          auVar171._0_8_ = 0x7fffffff7fffffff;
          auVar171._12_4_ = 0x7fffffff;
          auVar171._16_4_ = 0x7fffffff;
          auVar171._20_4_ = 0x7fffffff;
          auVar171._24_4_ = 0x7fffffff;
          auVar171._28_4_ = 0x7fffffff;
          auVar101 = vandps_avx(auVar154,auVar171);
          auVar172._8_4_ = 0x3e99999a;
          auVar172._0_8_ = 0x3e99999a3e99999a;
          auVar172._12_4_ = 0x3e99999a;
          auVar172._16_4_ = 0x3e99999a;
          auVar172._20_4_ = 0x3e99999a;
          auVar172._24_4_ = 0x3e99999a;
          auVar172._28_4_ = 0x3e99999a;
          auVar101 = vcmpps_avx(auVar101,auVar172,1);
          auVar155 = vorps_avx(auVar101,local_6c0);
          auVar173._0_4_ = (float)local_740._0_4_ + (float)local_900;
          auVar173._4_4_ = (float)local_740._4_4_ + local_900._4_4_;
          auVar173._8_4_ = fStack_738 + (float)uStack_8f8;
          auVar173._12_4_ = fStack_734 + uStack_8f8._4_4_;
          auVar173._16_4_ = fStack_730 + (float)uStack_8f0;
          auVar173._20_4_ = fStack_72c + uStack_8f0._4_4_;
          auVar173._24_4_ = fStack_728 + (float)uStack_8e8;
          auVar173._28_4_ = fStack_724 + uStack_8e8._4_4_;
          auVar101 = vcmpps_avx(auVar173,auVar110,2);
          _local_8a0 = vandps_avx(auVar101,local_760);
          auVar174._8_4_ = 3;
          auVar174._0_8_ = 0x300000003;
          auVar174._12_4_ = 3;
          auVar174._16_4_ = 3;
          auVar174._20_4_ = 3;
          auVar174._24_4_ = 3;
          auVar174._28_4_ = 3;
          auVar201._8_4_ = 2;
          auVar201._0_8_ = 0x200000002;
          auVar201._12_4_ = 2;
          auVar201._16_4_ = 2;
          auVar201._20_4_ = 2;
          auVar201._24_4_ = 2;
          auVar201._28_4_ = 2;
          auVar101 = vblendvps_avx(auVar201,auVar174,auVar155);
          auVar237 = vpcmpgtd_avx(auVar101._16_16_,local_700);
          auVar190 = vpshufd_avx(local_6e0._0_16_,0);
          auVar190 = vpcmpgtd_avx(auVar101._0_16_,auVar190);
          auVar175._16_16_ = auVar237;
          auVar175._0_16_ = auVar110._0_16_;
          _local_880 = vblendps_avx(ZEXT1632(auVar190),auVar175,0xf0);
          auVar101 = vandnps_avx(_local_880,_local_8a0);
          auVar155 = _local_8a0 & ~_local_880;
          local_660 = auVar101;
          if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar155 >> 0x7f,0) != '\0') ||
                (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar155 >> 0xbf,0) != '\0') ||
              (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar155[0x1f] < '\0') {
            local_920._0_4_ = uVar83;
            local_860._4_4_ = local_900._4_4_ + local_3c0._4_4_;
            local_860._0_4_ = (float)local_900 + local_3c0._0_4_;
            fStack_858 = (float)uStack_8f8 + local_3c0._8_4_;
            fStack_854 = uStack_8f8._4_4_ + local_3c0._12_4_;
            fStack_850 = (float)uStack_8f0 + local_3c0._16_4_;
            fStack_84c = uStack_8f0._4_4_ + local_3c0._20_4_;
            fStack_848 = (float)uStack_8e8 + local_3c0._24_4_;
            fStack_844 = uStack_8e8._4_4_ + local_3c0._28_4_;
            _local_960 = local_3c0;
            do {
              auVar114._8_4_ = 0x7f800000;
              auVar114._0_8_ = 0x7f8000007f800000;
              auVar114._12_4_ = 0x7f800000;
              auVar114._16_4_ = 0x7f800000;
              auVar114._20_4_ = 0x7f800000;
              auVar114._24_4_ = 0x7f800000;
              auVar114._28_4_ = 0x7f800000;
              auVar155 = vblendvps_avx(auVar114,_local_960,auVar101);
              auVar13 = vshufps_avx(auVar155,auVar155,0xb1);
              auVar13 = vminps_avx(auVar155,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar13 = vcmpps_avx(auVar155,auVar13,0);
              auVar14 = auVar101 & auVar13;
              auVar155 = auVar101;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar155 = vandps_avx(auVar13,auVar101);
              }
              uVar84 = vmovmskps_avx(auVar155);
              uVar83 = 0;
              if (uVar84 != 0) {
                for (; (uVar84 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
              uVar82 = (ulong)uVar83;
              local_660 = auVar101;
              *(undefined4 *)(local_660 + uVar82 * 4) = 0;
              fVar202 = local_1c0[uVar82];
              uVar83 = *(uint *)(local_3a0 + uVar82 * 4);
              fVar203 = auVar5._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar203 = sqrtf((float)local_980._0_4_);
              }
              auVar190 = vminps_avx(_local_ae0,_local_b00);
              auVar237 = vmaxps_avx(_local_ae0,_local_b00);
              auVar6 = vminps_avx(_local_af0,_local_b10);
              auVar98 = vminps_avx(auVar190,auVar6);
              auVar190 = vmaxps_avx(_local_af0,_local_b10);
              auVar6 = vmaxps_avx(auVar237,auVar190);
              auVar185._8_4_ = 0x7fffffff;
              auVar185._0_8_ = 0x7fffffff7fffffff;
              auVar185._12_4_ = 0x7fffffff;
              auVar237 = vandps_avx(auVar98,auVar185);
              auVar190 = vandps_avx(auVar6,auVar185);
              auVar237 = vmaxps_avx(auVar237,auVar190);
              auVar190 = vmovshdup_avx(auVar237);
              auVar190 = vmaxss_avx(auVar190,auVar237);
              auVar237 = vshufpd_avx(auVar237,auVar237,1);
              auVar237 = vmaxss_avx(auVar237,auVar190);
              local_aa0._0_4_ = auVar237._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar203 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar6,auVar6,0xff);
              auVar237 = vinsertps_avx(ZEXT416(uVar83),ZEXT416((uint)fVar202),0x10);
              lVar89 = 5;
              do {
                auVar190 = vmovshdup_avx(auVar237);
                fVar233 = auVar190._0_4_;
                fVar206 = 1.0 - fVar233;
                auVar190 = vshufps_avx(auVar237,auVar237,0x55);
                fVar202 = auVar190._0_4_;
                fVar203 = auVar190._4_4_;
                fVar204 = auVar190._8_4_;
                fVar205 = auVar190._12_4_;
                auVar190 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
                fVar207 = auVar190._0_4_;
                fVar208 = auVar190._4_4_;
                fVar224 = auVar190._8_4_;
                fVar225 = auVar190._12_4_;
                fVar226 = (float)local_af0._0_4_ * fVar202 + (float)local_b00._0_4_ * fVar207;
                fVar227 = (float)local_af0._4_4_ * fVar203 + (float)local_b00._4_4_ * fVar208;
                fVar229 = fStack_ae8 * fVar204 + fStack_af8 * fVar224;
                fVar231 = fStack_ae4 * fVar205 + fStack_af4 * fVar225;
                auVar240._0_4_ =
                     fVar207 * ((float)local_b00._0_4_ * fVar202 + fVar207 * (float)local_ae0._0_4_)
                     + fVar202 * fVar226;
                auVar240._4_4_ =
                     fVar208 * ((float)local_b00._4_4_ * fVar203 + fVar208 * (float)local_ae0._4_4_)
                     + fVar203 * fVar227;
                auVar240._8_4_ =
                     fVar224 * (fStack_af8 * fVar204 + fVar224 * fStack_ad8) + fVar204 * fVar229;
                auVar240._12_4_ =
                     fVar225 * (fStack_af4 * fVar205 + fVar225 * fStack_ad4) + fVar205 * fVar231;
                auVar186._0_4_ =
                     fVar207 * fVar226 +
                     fVar202 * (fVar202 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar207)
                ;
                auVar186._4_4_ =
                     fVar208 * fVar227 +
                     fVar203 * (fVar203 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar208)
                ;
                auVar186._8_4_ =
                     fVar224 * fVar229 + fVar204 * (fVar204 * fStack_b08 + fStack_ae8 * fVar224);
                auVar186._12_4_ =
                     fVar225 * fVar231 + fVar205 * (fVar205 * fStack_b04 + fStack_ae4 * fVar225);
                auVar190 = vshufps_avx(auVar237,auVar237,0);
                auVar138._0_4_ = auVar190._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar138._4_4_ = auVar190._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar138._8_4_ = auVar190._8_4_ * fStack_968 + 0.0;
                auVar138._12_4_ = auVar190._12_4_ * fStack_964 + 0.0;
                auVar97._0_4_ = fVar207 * auVar240._0_4_ + fVar202 * auVar186._0_4_;
                auVar97._4_4_ = fVar208 * auVar240._4_4_ + fVar203 * auVar186._4_4_;
                auVar97._8_4_ = fVar224 * auVar240._8_4_ + fVar204 * auVar186._8_4_;
                auVar97._12_4_ = fVar225 * auVar240._12_4_ + fVar205 * auVar186._12_4_;
                local_8e0._0_16_ = auVar97;
                auVar190 = vsubps_avx(auVar138,auVar97);
                _local_a00 = auVar190;
                auVar190 = vdpps_avx(auVar190,auVar190,0x7f);
                fVar202 = auVar190._0_4_;
                if (fVar202 < 0.0) {
                  fVar203 = sqrtf(fVar202);
                }
                else {
                  auVar6 = vsqrtss_avx(auVar190,auVar190);
                  fVar203 = auVar6._0_4_;
                }
                auVar6 = vsubps_avx(auVar186,auVar240);
                auVar269._0_4_ = auVar6._0_4_ * 3.0;
                auVar269._4_4_ = auVar6._4_4_ * 3.0;
                auVar269._8_4_ = auVar6._8_4_ * 3.0;
                auVar269._12_4_ = auVar6._12_4_ * 3.0;
                auVar6 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0)),0
                                    );
                auVar98 = ZEXT416((uint)((fVar206 - (fVar233 + fVar233)) * 6.0));
                auVar161 = vshufps_avx(auVar98,auVar98,0);
                auVar98 = ZEXT416((uint)((fVar233 - (fVar206 + fVar206)) * 6.0));
                auVar187 = vshufps_avx(auVar98,auVar98,0);
                auVar92 = vshufps_avx(ZEXT416((uint)(fVar206 * 6.0)),ZEXT416((uint)(fVar206 * 6.0)),
                                      0);
                auVar98 = vdpps_avx(auVar269,auVar269,0x7f);
                auVar139._0_4_ =
                     auVar92._0_4_ * (float)local_ae0._0_4_ +
                     auVar187._0_4_ * (float)local_b00._0_4_ +
                     auVar6._0_4_ * (float)local_b10._0_4_ + auVar161._0_4_ * (float)local_af0._0_4_
                ;
                auVar139._4_4_ =
                     auVar92._4_4_ * (float)local_ae0._4_4_ +
                     auVar187._4_4_ * (float)local_b00._4_4_ +
                     auVar6._4_4_ * (float)local_b10._4_4_ + auVar161._4_4_ * (float)local_af0._4_4_
                ;
                auVar139._8_4_ =
                     auVar92._8_4_ * fStack_ad8 +
                     auVar187._8_4_ * fStack_af8 +
                     auVar6._8_4_ * fStack_b08 + auVar161._8_4_ * fStack_ae8;
                auVar139._12_4_ =
                     auVar92._12_4_ * fStack_ad4 +
                     auVar187._12_4_ * fStack_af4 +
                     auVar6._12_4_ * fStack_b04 + auVar161._12_4_ * fStack_ae4;
                auVar6 = vblendps_avx(auVar98,_DAT_01f7aa10,0xe);
                auVar161 = vrsqrtss_avx(auVar6,auVar6);
                fVar205 = auVar161._0_4_;
                fVar204 = auVar98._0_4_;
                auVar161 = vdpps_avx(auVar269,auVar139,0x7f);
                auVar187 = vshufps_avx(auVar98,auVar98,0);
                auVar140._0_4_ = auVar139._0_4_ * auVar187._0_4_;
                auVar140._4_4_ = auVar139._4_4_ * auVar187._4_4_;
                auVar140._8_4_ = auVar139._8_4_ * auVar187._8_4_;
                auVar140._12_4_ = auVar139._12_4_ * auVar187._12_4_;
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                auVar214._0_4_ = auVar269._0_4_ * auVar161._0_4_;
                auVar214._4_4_ = auVar269._4_4_ * auVar161._4_4_;
                auVar214._8_4_ = auVar269._8_4_ * auVar161._8_4_;
                auVar214._12_4_ = auVar269._12_4_ * auVar161._12_4_;
                auVar92 = vsubps_avx(auVar140,auVar214);
                auVar161 = vrcpss_avx(auVar6,auVar6);
                auVar6 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                    ZEXT416((uint)(auVar237._0_4_ * (float)local_780._0_4_)));
                auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar204 * auVar161._0_4_)));
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                uVar82 = CONCAT44(auVar269._4_4_,auVar269._0_4_);
                auVar324._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar324._8_4_ = -auVar269._8_4_;
                auVar324._12_4_ = -auVar269._12_4_;
                auVar187 = ZEXT416((uint)(fVar205 * 1.5 +
                                         fVar204 * -0.5 * fVar205 * fVar205 * fVar205));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar188._0_4_ = auVar187._0_4_ * auVar92._0_4_ * auVar161._0_4_;
                auVar188._4_4_ = auVar187._4_4_ * auVar92._4_4_ * auVar161._4_4_;
                auVar188._8_4_ = auVar187._8_4_ * auVar92._8_4_ * auVar161._8_4_;
                auVar188._12_4_ = auVar187._12_4_ * auVar92._12_4_ * auVar161._12_4_;
                local_9a0._0_4_ = auVar269._0_4_ * auVar187._0_4_;
                local_9a0._4_4_ = auVar269._4_4_ * auVar187._4_4_;
                local_9a0._8_4_ = auVar269._8_4_ * auVar187._8_4_;
                local_9a0._12_4_ = auVar269._12_4_ * auVar187._12_4_;
                if (fVar204 < 0.0) {
                  local_9c0._0_16_ = auVar188;
                  fVar204 = sqrtf(fVar204);
                  auVar188 = local_9c0._0_16_;
                }
                else {
                  auVar98 = vsqrtss_avx(auVar98,auVar98);
                  fVar204 = auVar98._0_4_;
                }
                auVar98 = vdpps_avx(_local_a00,local_9a0._0_16_,0x7f);
                fVar203 = ((float)local_aa0._0_4_ / fVar204) * (fVar203 + 1.0) +
                          fVar203 * (float)local_aa0._0_4_ + auVar6._0_4_;
                auVar161 = vdpps_avx(auVar324,local_9a0._0_16_,0x7f);
                auVar187 = vdpps_avx(_local_a00,auVar188,0x7f);
                auVar92 = vdpps_avx(_local_970,local_9a0._0_16_,0x7f);
                auVar130 = vdpps_avx(_local_a00,auVar324,0x7f);
                fVar204 = auVar161._0_4_ + auVar187._0_4_;
                fVar205 = auVar98._0_4_;
                auVar99._0_4_ = fVar205 * fVar205;
                auVar99._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                auVar99._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                auVar99._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                auVar187 = vsubps_avx(auVar190,auVar99);
                local_9a0._0_16_ = ZEXT416((uint)fVar204);
                auVar161 = vdpps_avx(_local_a00,_local_970,0x7f);
                fVar206 = auVar130._0_4_ - fVar205 * fVar204;
                fVar205 = auVar161._0_4_ - fVar205 * auVar92._0_4_;
                auVar161 = vrsqrtss_avx(auVar187,auVar187);
                fVar207 = auVar187._0_4_;
                fVar204 = auVar161._0_4_;
                fVar204 = fVar204 * 1.5 + fVar207 * -0.5 * fVar204 * fVar204 * fVar204;
                if (fVar207 < 0.0) {
                  local_9c0._0_16_ = auVar92;
                  local_940._0_4_ = fVar205;
                  local_7a0._0_4_ = fVar204;
                  local_9e0 = fVar206;
                  fVar207 = sqrtf(fVar207);
                  fVar204 = (float)local_7a0._0_4_;
                  fVar206 = local_9e0;
                  fVar205 = (float)local_940._0_4_;
                  auVar92 = local_9c0._0_16_;
                }
                else {
                  auVar161 = vsqrtss_avx(auVar187,auVar187);
                  fVar207 = auVar161._0_4_;
                }
                auVar130 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar131 = vshufps_avx(auVar269,auVar269,0xff);
                fVar206 = fVar206 * fVar204 - auVar131._0_4_;
                auVar215._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar92._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar92._12_4_ ^ 0x80000000;
                auVar241._0_4_ = -fVar206;
                auVar241._4_4_ = 0x80000000;
                auVar241._8_4_ = 0x80000000;
                auVar241._12_4_ = 0x80000000;
                auVar161 = vinsertps_avx(auVar241,ZEXT416((uint)(fVar205 * fVar204)),0x1c);
                auVar92 = vmovsldup_avx(ZEXT416((uint)(local_9a0._0_4_ * fVar205 * fVar204 -
                                                      auVar92._0_4_ * fVar206)));
                auVar161 = vdivps_avx(auVar161,auVar92);
                auVar187 = vinsertps_avx(local_9a0._0_16_,auVar215,0x10);
                auVar187 = vdivps_avx(auVar187,auVar92);
                auVar92 = vmovsldup_avx(auVar98);
                auVar100 = ZEXT416((uint)(fVar207 - auVar130._0_4_));
                auVar130 = vmovsldup_avx(auVar100);
                auVar162._0_4_ = auVar92._0_4_ * auVar161._0_4_ + auVar130._0_4_ * auVar187._0_4_;
                auVar162._4_4_ = auVar92._4_4_ * auVar161._4_4_ + auVar130._4_4_ * auVar187._4_4_;
                auVar162._8_4_ = auVar92._8_4_ * auVar161._8_4_ + auVar130._8_4_ * auVar187._8_4_;
                auVar162._12_4_ =
                     auVar92._12_4_ * auVar161._12_4_ + auVar130._12_4_ * auVar187._12_4_;
                auVar237 = vsubps_avx(auVar237,auVar162);
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar98 = vandps_avx(auVar98,auVar163);
                if (auVar98._0_4_ < fVar203) {
                  auVar189._8_4_ = 0x7fffffff;
                  auVar189._0_8_ = 0x7fffffff7fffffff;
                  auVar189._12_4_ = 0x7fffffff;
                  auVar98 = vandps_avx(auVar100,auVar189);
                  if (auVar98._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar203 + auVar6._0_4_) {
                    fVar203 = auVar237._0_4_ + (float)local_8c0._0_4_;
                    auVar281 = ZEXT3264(local_a80);
                    if ((fVar203 < fVar177) ||
                       (fVar204 = *(float *)(ray + k * 4 + 0x100), fVar204 < fVar203)) break;
                    auVar6 = vmovshdup_avx(auVar237);
                    fVar205 = auVar6._0_4_;
                    if ((fVar205 < 0.0) || (1.0 < fVar205)) break;
                    auVar190 = vrsqrtss_avx(auVar190,auVar190);
                    fVar206 = auVar190._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar190 = ZEXT416((uint)(fVar206 * 1.5 +
                                             fVar202 * -0.5 * fVar206 * fVar206 * fVar206));
                    auVar190 = vshufps_avx(auVar190,auVar190,0);
                    auVar191._0_4_ = auVar190._0_4_ * (float)local_a00._0_4_;
                    auVar191._4_4_ = auVar190._4_4_ * (float)local_a00._4_4_;
                    auVar191._8_4_ = auVar190._8_4_ * fStack_9f8;
                    auVar191._12_4_ = auVar190._12_4_ * fStack_9f4;
                    auVar141._0_4_ = auVar269._0_4_ + auVar131._0_4_ * auVar191._0_4_;
                    auVar141._4_4_ = auVar269._4_4_ + auVar131._4_4_ * auVar191._4_4_;
                    auVar141._8_4_ = auVar269._8_4_ + auVar131._8_4_ * auVar191._8_4_;
                    auVar141._12_4_ = auVar269._12_4_ + auVar131._12_4_ * auVar191._12_4_;
                    auVar190 = vshufps_avx(auVar191,auVar191,0xc9);
                    auVar6 = vshufps_avx(auVar269,auVar269,0xc9);
                    auVar192._0_4_ = auVar6._0_4_ * auVar191._0_4_;
                    auVar192._4_4_ = auVar6._4_4_ * auVar191._4_4_;
                    auVar192._8_4_ = auVar6._8_4_ * auVar191._8_4_;
                    auVar192._12_4_ = auVar6._12_4_ * auVar191._12_4_;
                    auVar216._0_4_ = auVar269._0_4_ * auVar190._0_4_;
                    auVar216._4_4_ = auVar269._4_4_ * auVar190._4_4_;
                    auVar216._8_4_ = auVar269._8_4_ * auVar190._8_4_;
                    auVar216._12_4_ = auVar269._12_4_ * auVar190._12_4_;
                    auVar98 = vsubps_avx(auVar216,auVar192);
                    auVar190 = vshufps_avx(auVar98,auVar98,0xc9);
                    auVar6 = vshufps_avx(auVar141,auVar141,0xc9);
                    auVar217._0_4_ = auVar6._0_4_ * auVar190._0_4_;
                    auVar217._4_4_ = auVar6._4_4_ * auVar190._4_4_;
                    auVar217._8_4_ = auVar6._8_4_ * auVar190._8_4_;
                    auVar217._12_4_ = auVar6._12_4_ * auVar190._12_4_;
                    auVar190 = vshufps_avx(auVar98,auVar98,0xd2);
                    auVar142._0_4_ = auVar141._0_4_ * auVar190._0_4_;
                    auVar142._4_4_ = auVar141._4_4_ * auVar190._4_4_;
                    auVar142._8_4_ = auVar141._8_4_ * auVar190._8_4_;
                    auVar142._12_4_ = auVar141._12_4_ * auVar190._12_4_;
                    auVar190 = vsubps_avx(auVar217,auVar142);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar203;
                      uVar1 = vextractps_avx(auVar190,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar190,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar190._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar205;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(undefined4 *)(ray + k * 4 + 0x220) = local_920._0_4_;
                      *(uint *)(ray + k * 4 + 0x240) = uVar88;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar9 = context->user;
                    auStack_590 = vshufps_avx(auVar237,auVar237,0x55);
                    auStack_5f0 = vshufps_avx(auVar190,auVar190,0x55);
                    auStack_5d0 = vshufps_avx(auVar190,auVar190,0xaa);
                    auStack_5b0 = vshufps_avx(auVar190,auVar190,0);
                    local_600 = (RTCHitN  [16])auStack_5f0;
                    local_5e0 = auStack_5d0;
                    local_5c0 = auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = ZEXT832(0) << 0x20;
                    local_560 = local_4a0._0_8_;
                    uStack_558 = local_4a0._8_8_;
                    uStack_550 = local_4a0._16_8_;
                    uStack_548 = local_4a0._24_8_;
                    local_540 = local_480._0_8_;
                    uStack_538 = local_480._8_8_;
                    uStack_530 = local_480._16_8_;
                    uStack_528 = local_480._24_8_;
                    *(undefined8 *)(local_a30 + 8) = local_a20._0_8_;
                    *(undefined8 *)(local_a30 + 10) = local_a20._8_8_;
                    *(undefined8 *)(local_a30 + 0xc) = local_a20._16_8_;
                    *(undefined8 *)(local_a30 + 0xe) = local_a20._24_8_;
                    *(undefined8 *)local_a30 = local_a20._0_8_;
                    *(undefined8 *)(local_a30 + 2) = local_a20._8_8_;
                    *(undefined8 *)(local_a30 + 4) = local_a20._16_8_;
                    *(undefined8 *)(local_a30 + 6) = local_a20._24_8_;
                    local_520 = pRVar9->instID[0];
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    uStack_510 = local_520;
                    uStack_50c = local_520;
                    uStack_508 = local_520;
                    uStack_504 = local_520;
                    local_500 = pRVar9->instPrimID[0];
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    uStack_4f0 = local_500;
                    uStack_4ec = local_500;
                    uStack_4e8 = local_500;
                    uStack_4e4 = local_500;
                    *(float *)(ray + k * 4 + 0x100) = fVar203;
                    local_b40 = *local_a38;
                    local_b30 = *local_a40;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar8->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_600;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_ad0);
                      auVar281 = ZEXT3264(local_a80);
                    }
                    auVar237 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar190 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar176._16_16_ = auVar190;
                    auVar176._0_16_ = auVar237;
                    auVar101 = local_a20 & ~auVar176;
                    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0x7f,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0xbf,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar101[0x1f] < '\0') {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&local_ad0);
                        auVar281 = ZEXT3264(local_a80);
                      }
                      auVar237 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar190 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar115._16_16_ = auVar190;
                      auVar115._0_16_ = auVar237;
                      auVar101 = local_a20 & ~auVar115;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar101 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar101 >> 0x7f,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0xbf,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar101[0x1f] < '\0') {
                        auVar116._0_4_ = auVar237._0_4_ ^ local_a20._0_4_;
                        auVar116._4_4_ = auVar237._4_4_ ^ local_a20._4_4_;
                        auVar116._8_4_ = auVar237._8_4_ ^ local_a20._8_4_;
                        auVar116._12_4_ = auVar237._12_4_ ^ local_a20._12_4_;
                        auVar116._16_4_ = auVar190._0_4_ ^ local_a20._16_4_;
                        auVar116._20_4_ = auVar190._4_4_ ^ local_a20._20_4_;
                        auVar116._24_4_ = auVar190._8_4_ ^ local_a20._24_4_;
                        auVar116._28_4_ = auVar190._12_4_ ^ local_a20._28_4_;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar101;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar204;
                    break;
                  }
                }
                lVar89 = lVar89 + -1;
                auVar281 = ZEXT3264(local_a80);
              } while (lVar89 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar110._4_4_ = uVar1;
              auVar110._0_4_ = uVar1;
              auVar110._8_4_ = uVar1;
              auVar110._12_4_ = uVar1;
              auVar110._16_4_ = uVar1;
              auVar110._20_4_ = uVar1;
              auVar110._24_4_ = uVar1;
              auVar110._28_4_ = uVar1;
              auVar155 = vcmpps_avx(_local_860,auVar110,2);
              auVar101 = vandps_avx(auVar155,local_660);
              local_660 = local_660 & auVar155;
            } while ((((((((local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_660 >> 0x7f,0) != '\0') ||
                       (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_660 >> 0xbf,0) != '\0') ||
                     (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_660[0x1f] < '\0');
            uVar83 = local_920._0_4_;
            local_660 = auVar101;
          }
          auVar362 = ZEXT3264(local_a60);
          auVar402 = ZEXT3264(local_840);
          auVar101 = vandps_avx(local_6a0,local_680);
          auVar155 = vandps_avx(_local_8a0,_local_880);
          auVar222._0_4_ = (float)local_900 + local_400._0_4_;
          auVar222._4_4_ = local_900._4_4_ + local_400._4_4_;
          auVar222._8_4_ = (float)uStack_8f8 + local_400._8_4_;
          auVar222._12_4_ = uStack_8f8._4_4_ + local_400._12_4_;
          auVar222._16_4_ = (float)uStack_8f0 + local_400._16_4_;
          auVar222._20_4_ = uStack_8f0._4_4_ + local_400._20_4_;
          auVar222._24_4_ = (float)uStack_8e8 + local_400._24_4_;
          auVar222._28_4_ = uStack_8e8._4_4_ + local_400._28_4_;
          auVar13 = vcmpps_avx(auVar222,auVar110,2);
          auVar101 = vandps_avx(auVar13,auVar101);
          auVar223._0_4_ = (float)local_900 + local_3c0._0_4_;
          auVar223._4_4_ = local_900._4_4_ + local_3c0._4_4_;
          auVar223._8_4_ = (float)uStack_8f8 + local_3c0._8_4_;
          auVar223._12_4_ = uStack_8f8._4_4_ + local_3c0._12_4_;
          auVar223._16_4_ = (float)uStack_8f0 + local_3c0._16_4_;
          auVar223._20_4_ = uStack_8f0._4_4_ + local_3c0._20_4_;
          auVar223._24_4_ = (float)uStack_8e8 + local_3c0._24_4_;
          auVar223._28_4_ = uStack_8e8._4_4_ + local_3c0._28_4_;
          auVar13 = vcmpps_avx(auVar223,auVar110,2);
          auVar155 = vandps_avx(auVar13,auVar155);
          auVar155 = vorps_avx(auVar101,auVar155);
          if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar155 >> 0x7f,0) != '\0') ||
                (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar155 >> 0xbf,0) != '\0') ||
              (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar155[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x60) = auVar155;
            auVar101 = vblendvps_avx(local_3c0,_local_400,auVar101);
            *(undefined1 (*) [32])(auStack_160 + uVar86 * 0x60) = auVar101;
            uVar2 = vmovlps_avx(local_610);
            (&uStack_140)[uVar86 * 0xc] = uVar2;
            aiStack_138[uVar86 * 0x18] = local_cc8 + 1;
            iVar87 = iVar87 + 1;
          }
          goto LAB_00fedd2b;
        }
      }
      auVar362 = ZEXT3264(local_a60);
      auVar281 = ZEXT3264(local_a80);
      auVar402 = ZEXT3264(local_840);
    }
LAB_00fedd2b:
    auVar244 = local_440;
    if (iVar87 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar107._4_4_ = uVar1;
    auVar107._0_4_ = uVar1;
    auVar107._8_4_ = uVar1;
    auVar107._12_4_ = uVar1;
    auVar107._16_4_ = uVar1;
    auVar107._20_4_ = uVar1;
    auVar107._24_4_ = uVar1;
    auVar107._28_4_ = uVar1;
    uVar84 = -iVar87;
    pauVar81 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar87 - 1) * 0x60);
    while( true ) {
      auVar101 = pauVar81[1];
      auVar149._0_4_ = (float)local_900 + auVar101._0_4_;
      auVar149._4_4_ = local_900._4_4_ + auVar101._4_4_;
      auVar149._8_4_ = (float)uStack_8f8 + auVar101._8_4_;
      auVar149._12_4_ = uStack_8f8._4_4_ + auVar101._12_4_;
      auVar149._16_4_ = (float)uStack_8f0 + auVar101._16_4_;
      auVar149._20_4_ = uStack_8f0._4_4_ + auVar101._20_4_;
      auVar149._24_4_ = (float)uStack_8e8 + auVar101._24_4_;
      auVar149._28_4_ = uStack_8e8._4_4_ + auVar101._28_4_;
      auVar13 = vcmpps_avx(auVar149,auVar107,2);
      auVar155 = vandps_avx(auVar13,*pauVar81);
      _local_600 = auVar155;
      auVar13 = *pauVar81 & auVar13;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') break;
      pauVar81 = pauVar81 + -3;
      uVar84 = uVar84 + 1;
      if (uVar84 == 0) goto LAB_00fef98e;
    }
    auVar108._8_4_ = 0x7f800000;
    auVar108._0_8_ = 0x7f8000007f800000;
    auVar108._12_4_ = 0x7f800000;
    auVar108._16_4_ = 0x7f800000;
    auVar108._20_4_ = 0x7f800000;
    auVar108._24_4_ = 0x7f800000;
    auVar108._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar108,auVar101,auVar155);
    auVar13 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar13 = vminps_avx(auVar101,auVar13);
    auVar14 = vshufpd_avx(auVar13,auVar13,5);
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar14 = vperm2f128_avx(auVar13,auVar13,1);
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar101 = vcmpps_avx(auVar101,auVar13,0);
    auVar13 = auVar155 & auVar101;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar155 = vandps_avx(auVar101,auVar155);
    }
    auVar94._8_8_ = 0;
    auVar94._0_8_ = *(ulong *)pauVar81[2];
    local_cc8 = *(uint *)(pauVar81[2] + 8);
    uVar85 = vmovmskps_avx(auVar155);
    uVar11 = 0;
    if (uVar85 != 0) {
      for (; (uVar85 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    *(undefined4 *)(local_600 + (ulong)uVar11 * 4) = 0;
    *pauVar81 = _local_600;
    uVar85 = ~uVar84;
    if ((((((((_local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_600 >> 0x7f,0) != '\0') ||
          (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_600 >> 0xbf,0) != '\0') ||
        (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_600[0x1f] < '\0') {
      uVar85 = -uVar84;
    }
    uVar86 = (ulong)uVar85;
    auVar237 = vshufps_avx(auVar94,auVar94,0);
    auVar190 = vshufps_avx(auVar94,auVar94,0x55);
    auVar190 = vsubps_avx(auVar190,auVar237);
    local_400._4_4_ = auVar237._4_4_ + auVar190._4_4_ * 0.14285715;
    local_400._0_4_ = auVar237._0_4_ + auVar190._0_4_ * 0.0;
    fStack_3f8 = auVar237._8_4_ + auVar190._8_4_ * 0.2857143;
    fStack_3f4 = auVar237._12_4_ + auVar190._12_4_ * 0.42857146;
    fStack_3f0 = auVar237._0_4_ + auVar190._0_4_ * 0.5714286;
    fStack_3ec = auVar237._4_4_ + auVar190._4_4_ * 0.71428573;
    fStack_3e8 = auVar237._8_4_ + auVar190._8_4_ * 0.8571429;
    fStack_3e4 = auVar237._12_4_ + auVar190._12_4_;
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_400 + (ulong)uVar11 * 4);
  } while( true );
LAB_00fef98e:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar119._4_4_ = uVar1;
  auVar119._0_4_ = uVar1;
  auVar119._8_4_ = uVar1;
  auVar119._12_4_ = uVar1;
  auVar119._16_4_ = uVar1;
  auVar119._20_4_ = uVar1;
  auVar119._24_4_ = uVar1;
  auVar119._28_4_ = uVar1;
  auVar101 = vcmpps_avx(local_320,auVar119,2);
  uVar83 = vmovmskps_avx(auVar101);
  uVar83 = (uint)uVar90 & uVar83;
  if (uVar83 == 0) {
    return;
  }
  goto LAB_00fecc15;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }